

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_compact_uncommitted_db(void)

{
  list_elem **pplVar1;
  uint64_t *__s;
  fdb_seqnum_t *__s_00;
  bottom_up_build_ctx *__s_01;
  fdb_commit_opt_t opt;
  fdb_file_handle *pfVar2;
  fdb_iterator *pfVar3;
  avl_node *__n;
  fdb_doc *doc;
  btree *pbVar4;
  size_t *psVar5;
  size_t keylen;
  fdb_config *pfVar6;
  long lVar7;
  undefined1 *puVar8;
  fdb_status fVar9;
  int iVar10;
  __atomic_base<unsigned_long> _Var11;
  size_t sVar12;
  __atomic_base<unsigned_long> _Var13;
  size_t sVar14;
  size_t sVar15;
  uint uVar16;
  __atomic_base<unsigned_long> _Var17;
  fdb_kvs_handle *pfVar18;
  __atomic_base<unsigned_long> _Var19;
  __atomic_base<unsigned_long> _Var20;
  char *fconfig_00;
  atomic<unsigned_char> *fconfig_01;
  fdb_doc *pfVar21;
  list *doc_00;
  fdb_kvs_handle *pfVar22;
  undefined1 *puVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  undefined1 *puVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  undefined1 *puVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  undefined1 *puVar41;
  undefined1 *puVar42;
  undefined1 *puVar43;
  undefined1 *puVar44;
  undefined1 *puVar45;
  undefined1 *puVar46;
  undefined1 *puVar47;
  fdb_kvs_handle *pfVar48;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar49;
  char *pcVar50;
  ulong uVar51;
  char *pcVar52;
  filemgr *pfVar53;
  hbtrie *doc_01;
  long lVar54;
  btreeblk_handle *pbVar55;
  btreeblk_handle *pbVar56;
  char *doc_02;
  char *pcVar57;
  filemgr *pfVar58;
  ulong uVar59;
  void *pvVar60;
  bool bVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  fdb_iterator *it;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char keybuf [256];
  fdb_config fconfig;
  uint8_t auStackY_11f01 [1805];
  fdb_commit_opt_t afStackY_117f4 [4132];
  fdb_kvs_handle afStack_107c0 [125];
  undefined8 uStack_858;
  undefined1 auStack_840 [8];
  fdb_config fStack_838;
  btreeblk_handle abStack_740 [2];
  int64_t aiStack_640 [32];
  list_elem *aplStack_540 [33];
  timeval tStack_438;
  undefined1 auStack_428 [32];
  btreeblk_handle *apbStack_408 [7];
  btreeblk_handle *pbStack_3d0;
  btreeblk_handle *pbStack_3c8;
  __atomic_base<unsigned_long> _Stack_3c0;
  undefined1 auStack_3b8 [8];
  undefined1 auStack_3b0 [16];
  __atomic_base<unsigned_long> _Stack_3a0;
  atomic<unsigned_long> aStack_398;
  atomic<unsigned_long> aStack_390;
  atomic<unsigned_long> aStack_380;
  char *pcStack_378;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_370;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_368;
  filemgr *local_360;
  __atomic_base<unsigned_long> local_358;
  timeval local_350;
  fdb_kvs_config local_340;
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  aStack_370.seqtree = (btree *)0x112040;
  gettimeofday(&local_350,(__timezone_ptr_t)0x0);
  aStack_370.seqtree = (btree *)0x112045;
  memleak_start();
  aStack_370.seqtree = (btree *)0x112055;
  fdb_get_default_config();
  aStack_370.seqtree = (btree *)0x112062;
  fdb_get_default_kvs_config();
  local_128.wal_threshold = 0x400;
  local_128.seqtree_opt = '\x01';
  local_128.flags = 1;
  aStack_370.seqtree = (btree *)0x112081;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_370.seqtree = (btree *)0x112098;
  fdb_open((fdb_file_handle **)&local_358,"./iterator_test1",&local_128);
  aStack_370.seqtree = (btree *)0x1120af;
  fdb_kvs_open((fdb_file_handle *)local_358._M_i,(fdb_kvs_handle **)&local_360,"db1",&local_340);
  pcVar52 = local_328 + 0x100;
  aVar49.seqtree = (btree *)0x0;
  do {
    aStack_370.seqtree = (btree *)0x1120d8;
    sprintf(pcVar52,"key%d",aVar49.seqtree);
    aStack_370.seqtree = (btree *)0x1120e7;
    sprintf(local_328,"body%d",aVar49.seqtree);
    pcVar57 = (char *)local_360;
    aStack_370.seqtree = (btree *)0x1120f4;
    _Var11._M_i = strlen(pcVar52);
    aStack_370.seqtree = (btree *)0x1120ff;
    sVar12 = strlen(local_328);
    aStack_370.seqtree = (btree *)0x112113;
    fdb_set_kv((fdb_kvs_handle *)pcVar57,pcVar52,_Var11._M_i,local_328,sVar12);
    aVar49._0_4_ = aVar49._0_4_ + 1;
    aVar49._4_4_ = 0;
  } while (aVar49._0_4_ != 10);
  aStack_370.seqtree = (btree *)0x11212e;
  fVar9 = fdb_iterator_sequence_init
                    ((fdb_kvs_handle *)local_360,(fdb_iterator **)&local_368.seqtree,0,0,0);
  if (fVar9 == FDB_RESULT_SUCCESS) {
    _Var11._M_i = 10;
    do {
      aStack_370.seqtree = (btree *)0x112144;
      fVar9 = fdb_iterator_next((fdb_iterator *)local_368.seqtree);
      uVar16 = (int)_Var11._M_i - 1;
      _Var11._M_i = (__int_type)uVar16;
    } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
    aStack_370.seqtree = (btree *)0x112154;
    fdb_iterator_close((fdb_iterator *)local_368.seqtree);
    if (uVar16 != 0) goto LAB_00112277;
    aStack_370.seqtree = (btree *)0x112168;
    fdb_compact((fdb_file_handle *)local_358._M_i,(char *)0x0);
    pcVar52 = local_328 + 0x100;
    aVar49.seqtree = (btree *)0x0;
    do {
      aStack_370.seqtree = (btree *)0x112191;
      sprintf(pcVar52,"key%d",aVar49.seqtree);
      aStack_370.seqtree = (btree *)0x1121a0;
      sprintf(local_328,"body%d",aVar49.seqtree);
      pcVar57 = (char *)local_360;
      aStack_370.seqtree = (btree *)0x1121ad;
      _Var11._M_i = strlen(pcVar52);
      aStack_370.seqtree = (btree *)0x1121b8;
      sVar12 = strlen(local_328);
      aStack_370.seqtree = (btree *)0x1121cc;
      fdb_set_kv((fdb_kvs_handle *)pcVar57,pcVar52,_Var11._M_i,local_328,sVar12);
      aVar49._0_4_ = aVar49._0_4_ + 1;
      aVar49._4_4_ = 0;
    } while (aVar49._0_4_ != 10);
    aStack_370.seqtree = (btree *)0x1121e7;
    fVar9 = fdb_iterator_sequence_init
                      ((fdb_kvs_handle *)local_360,(fdb_iterator **)&local_368.seqtree,0,0,0);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011227c;
    _Var11._M_i = 10;
    do {
      aStack_370.seqtree = (btree *)0x1121fd;
      fVar9 = fdb_iterator_next((fdb_iterator *)local_368.seqtree);
      uVar16 = (int)_Var11._M_i - 1;
      _Var11._M_i = (__int_type)uVar16;
    } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
    aStack_370.seqtree = (btree *)0x11220d;
    fdb_iterator_close((fdb_iterator *)local_368.seqtree);
    if (uVar16 == 0) {
      aStack_370.seqtree = (btree *)0x11221b;
      fdb_kvs_close((fdb_kvs_handle *)local_360);
      aStack_370.seqtree = (btree *)0x112225;
      fdb_close((fdb_file_handle *)local_358._M_i);
      aStack_370.seqtree = (btree *)0x11222a;
      fdb_shutdown();
      aStack_370.seqtree = (btree *)0x11222f;
      memleak_end();
      pcVar52 = "%s PASSED\n";
      if (iterator_compact_uncommitted_db()::__test_pass != '\0') {
        pcVar52 = "%s FAILED\n";
      }
      aStack_370.seqtree = (btree *)0x112260;
      fprintf(_stderr,pcVar52,"iterator compact uncommitted db");
      return;
    }
  }
  else {
    aStack_370.seqtree = (btree *)0x112277;
    iterator_compact_uncommitted_db();
LAB_00112277:
    aStack_370.seqtree = (btree *)0x11227c;
    iterator_compact_uncommitted_db();
LAB_0011227c:
    aStack_370.seqtree = (btree *)0x112281;
    iterator_compact_uncommitted_db();
  }
  _Var13._M_i = (__int_type)local_328;
  aStack_370.seqtree = (btree *)iterator_seek_test;
  iterator_compact_uncommitted_db();
  pcVar50 = (char *)&aStack_370;
  pcStack_378 = "body%d";
  puVar23 = auStack_840;
  puVar24 = auStack_840;
  puVar25 = auStack_840;
  puVar26 = auStack_840;
  puVar27 = auStack_840;
  puVar28 = auStack_840;
  puVar29 = auStack_840;
  puVar30 = auStack_840;
  puVar31 = auStack_840;
  puVar32 = auStack_840;
  puVar33 = auStack_840;
  puVar34 = auStack_840;
  puVar35 = auStack_840;
  puVar36 = auStack_840;
  puVar37 = auStack_840;
  puVar38 = auStack_840;
  puVar39 = auStack_840;
  puVar40 = auStack_840;
  puVar41 = auStack_840;
  puVar42 = auStack_840;
  puVar43 = auStack_840;
  puVar44 = auStack_840;
  puVar45 = auStack_840;
  puVar46 = auStack_840;
  puVar47 = auStack_840;
  pfVar48 = (fdb_kvs_handle *)auStack_840;
  _Var20._M_i = (__int_type)auStack_840;
  aStack_398.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var11._M_i;
  aStack_390.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
  aStack_380.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)((long)local_328 + 0x100);
  aStack_370 = aVar49;
  gettimeofday((timeval *)(aplStack_540 + 0x21),(__timezone_ptr_t)0x0);
  memleak_start();
  _Stack_3a0._M_i = 0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  _Var11._M_i = (__int_type)auStack_428;
  fdb_get_default_kvs_config();
  fStack_838.buffercache_size = 0;
  fStack_838.wal_threshold = 0x400;
  fStack_838.flags = 1;
  fStack_838.compaction_threshold = '\0';
  fStack_838.purging_interval = 1;
  pcVar52 = auStack_3b8;
  fdb_open((fdb_file_handle **)pcVar52,"./iterator_test1",&fStack_838);
  pfVar18 = (fdb_kvs_handle *)auStack_3b0;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_3b8,(fdb_kvs_handle **)pfVar18,(fdb_kvs_config *)_Var11._M_i
            );
  fVar9 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_3b0._0_8_,logCallbackFunc,"iterator_seek_test");
  pfVar22 = (fdb_kvs_handle *)auStack_840;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011317e;
  fVar9 = fdb_kvs_open((fdb_file_handle *)auStack_3b8,(fdb_kvs_handle **)&_Stack_3c0,"kv1",
                       (fdb_kvs_config *)auStack_428);
  puVar8 = auStack_840;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113183;
  _Var17._M_i = 0;
  pcVar52 = (char *)0x0;
  do {
    pplVar1 = &abStack_740[4].alc_list.tail;
    sprintf((char *)pplVar1,"kEy%d",(ulong)pcVar52 & 0xffffffff);
    sprintf((char *)abStack_740,"mEta%d",(ulong)pcVar52 & 0xffffffff);
    sprintf((char *)&abStack_740[2].ndeltanodes,"bOdy%d",(ulong)pcVar52 & 0xffffffff);
    pcVar57 = (char *)((long)&it + (long)&((fdb_kvs_handle *)(_Var17._M_i + -0x410))->kvs_config);
    _Var11._M_i = strlen((char *)pplVar1);
    _Var13._M_i = strlen((char *)abStack_740);
    sVar12 = strlen((char *)&abStack_740[2].ndeltanodes);
    uStack_858 = 0x11240a;
    fdb_doc_create((fdb_doc **)pcVar57,&abStack_740[4].alc_list.tail,_Var11._M_i,abStack_740,
                   _Var13._M_i,&abStack_740[2].ndeltanodes,sVar12);
    fVar9 = fdb_set((fdb_kvs_handle *)_Stack_3c0._M_i,
                    (fdb_doc *)
                    apbStack_408[(long)&((filemgr *)((long)pcVar52 + -0x2f0))->field_0x2ef]);
    if (fVar9 != FDB_RESULT_SUCCESS) {
      iterator_seek_test();
      goto LAB_0011312d;
    }
    fdb_doc_free((fdb_doc *)apbStack_408[(long)&((filemgr *)((long)pcVar52 + -0x2f0))->field_0x2ef])
    ;
    pcVar52 = &((fdb_kvs_config *)&((filemgr *)pcVar52)->filename)->field_0x1;
    _Var17._M_i = (__int_type)&(((fdb_kvs_handle *)_Var17._M_i)->kvs_config).custom_cmp;
  } while (pcVar52 != (undefined1 *)0xa);
  lVar54 = 8;
  uVar51 = 1;
  do {
    pplVar1 = &abStack_740[4].alc_list.tail;
    sprintf((char *)pplVar1,"key%d",uVar51 & 0xffffffff);
    sprintf((char *)abStack_740,"meta%d",uVar51 & 0xffffffff);
    sprintf((char *)&abStack_740[2].ndeltanodes,"body%d",uVar51 & 0xffffffff);
    sVar12 = strlen((char *)pplVar1);
    sVar14 = strlen((char *)abStack_740);
    sVar15 = strlen((char *)&abStack_740[2].ndeltanodes);
    uStack_858 = 0x1124f4;
    fdb_doc_create((fdb_doc **)(auStack_428 + lVar54 + 0x18),&abStack_740[4].alc_list.tail,sVar12,
                   abStack_740,sVar14,&abStack_740[2].ndeltanodes,sVar15);
    fdb_set((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_doc *)apbStack_408[uVar51 - 1]);
    lVar54 = lVar54 + 0x10;
    bVar61 = uVar51 < 8;
    uVar51 = uVar51 + 2;
  } while (bVar61);
  fdb_commit((fdb_file_handle *)auStack_3b8,'\x01');
  lVar54 = 0;
  uVar51 = 0;
  do {
    pplVar1 = &abStack_740[4].alc_list.tail;
    sprintf((char *)pplVar1,"key%d",uVar51 & 0xffffffff);
    sprintf((char *)abStack_740,"meta%d",uVar51 & 0xffffffff);
    sprintf((char *)&abStack_740[2].ndeltanodes,"body%d",uVar51 & 0xffffffff);
    pcVar57 = auStack_428 + lVar54 + 0x18;
    _Var11._M_i = strlen((char *)pplVar1);
    _Var13._M_i = strlen((char *)abStack_740);
    sVar12 = strlen((char *)&abStack_740[2].ndeltanodes);
    uStack_858 = 0x1125d4;
    fdb_doc_create((fdb_doc **)pcVar57,&abStack_740[4].alc_list.tail,_Var11._M_i,abStack_740,
                   _Var13._M_i,&abStack_740[2].ndeltanodes,sVar12);
    fdb_set((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_doc *)apbStack_408[uVar51 - 1]);
    pcVar52 = (char *)(uVar51 + 2);
    lVar54 = lVar54 + 0x10;
    bVar61 = uVar51 < 8;
    uVar51 = (ulong)pcVar52;
  } while (bVar61);
  fdb_commit((fdb_file_handle *)auStack_3b8,'\0');
  uStack_858 = 0x112629;
  fdb_iterator_init((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_iterator **)(auStack_3b0 + 8),
                    (void *)0x0,0,(void *)0x0,0,0);
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var17._M_i = _Stack_3a0._M_i;
  pbVar55 = (btreeblk_handle *)auStack_428._24_8_;
  pfVar18 = (fdb_kvs_handle *)(auStack_3b0 + 8);
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113188;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)((list *)(auStack_428._24_8_ + 0x18))->tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_0011318d;
  _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
  pcVar52 = *(char **)((long)pbVar55 + 0x38);
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
  if (iVar10 != 0) goto LAB_00113198;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
  pcVar52 = *(char **)((long)pbVar55 + 0x40);
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var17._M_i + 0x10));
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_001131a3;
  fdb_doc_free((fdb_doc *)_Var17._M_i);
  _Var17._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var11._M_i = (__int_type)(apbStack_408[1]->alc_list).tail;
  sVar12 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar9 = fdb_iterator_seek((fdb_iterator *)_Var17._M_i,(void *)_Var11._M_i,sVar12,'\0');
  if (fVar9 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001131ae;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var13._M_i = _Stack_3a0._M_i;
  pbVar56 = apbStack_408[1];
  puVar8 = auStack_840;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001131b3;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)(apbStack_408[1]->alc_list).tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  if (iVar10 != 0) goto LAB_001131b8;
  _Var11._M_i = *(__int_type *)(_Var13._M_i + 0x38);
  pcVar52 = (char *)pbVar56->file;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var13._M_i + 8));
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_001131c3;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var13._M_i + 0x40))->seqtree;
  pcVar52 = (char *)pbVar56->log_callback;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var13._M_i + 0x10));
  if (iVar10 != 0) goto LAB_001131ce;
  fdb_doc_free((fdb_doc *)_Var13._M_i);
  _Stack_3a0._M_i = 0;
  fVar9 = fdb_iterator_next((fdb_iterator *)auStack_3b0._8_8_);
  puVar8 = auStack_840;
  if (fVar9 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001131d9;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var17._M_i = _Stack_3a0._M_i;
  pbVar55 = apbStack_408[2];
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001131de;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)(apbStack_408[2]->alc_list).tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_001131e3;
  _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
  pcVar52 = (char *)pbVar55->file;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
  if (iVar10 != 0) goto LAB_001131ee;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
  pcVar52 = (char *)pbVar55->log_callback;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var17._M_i + 0x10));
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_001131f9;
  fdb_doc_free((fdb_doc *)_Var17._M_i);
  _Var17._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var11._M_i = (__int_type)(pbStack_3c8->alc_list).tail;
  sVar12 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar9 = fdb_iterator_seek((fdb_iterator *)_Var17._M_i,(void *)_Var11._M_i,sVar12,'\0');
  if (fVar9 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113204;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var19._M_i = _Stack_3a0._M_i;
  pbVar56 = pbStack_3c8;
  puVar8 = auStack_840;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113209;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)(pbStack_3c8->alc_list).tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  if (iVar10 != 0) goto LAB_0011320e;
  _Var11._M_i = *(__int_type *)(_Var19._M_i + 0x38);
  pcVar52 = (char *)pbVar56->file;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var19._M_i + 8));
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_00113219;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var19._M_i + 0x40))->seqtree;
  pcVar52 = (char *)pbVar56->log_callback;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var19._M_i + 0x10));
  if (iVar10 != 0) goto LAB_00113224;
  fdb_doc_free((fdb_doc *)_Var19._M_i);
  _Var19._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var11._M_i = (__int_type)((list *)(auStack_428._24_8_ + 0x18))->tail;
  sVar12 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar9 = fdb_iterator_seek((fdb_iterator *)_Var19._M_i,(void *)_Var11._M_i,sVar12,'\0');
  puVar8 = auStack_840;
  if (fVar9 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011322f;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var17._M_i = _Stack_3a0._M_i;
  _Var13._M_i = auStack_428._24_8_;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113234;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)((list *)(auStack_428._24_8_ + 0x18))->tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_00113239;
  _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
  pcVar52 = *(char **)(_Var13._M_i + 0x38);
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
  if (iVar10 != 0) goto LAB_00113244;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
  pcVar52 = *(char **)(_Var13._M_i + 0x40);
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var17._M_i + 0x10));
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_0011324f;
  fdb_doc_free((fdb_doc *)_Var17._M_i);
  _Var17._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var11._M_i = (__int_type)(apbStack_408[1]->alc_list).tail;
  sVar12 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar9 = fdb_iterator_seek((fdb_iterator *)_Var17._M_i,(void *)_Var11._M_i,sVar12,'\0');
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011325a;
  pcVar57 = (char *)0x2;
  _Var19._M_i = _Var11._M_i;
  do {
    fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
    _Var11._M_i = _Stack_3a0._M_i;
    pfVar18 = (fdb_kvs_handle *)_Var17._M_i;
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113138;
    pcVar52 = *(char **)(_Stack_3a0._M_i + 0x20);
    _Var17._M_i = (__int_type)
                  apbStack_408[(long)&((filemgr *)((long)pcVar57 + -0x2f0))->field_0x2ef];
    _Var13._M_i = (__int_type)((fdb_kvs_handle *)_Var17._M_i)->op_stats;
    iVar10 = bcmp(pcVar52,(void *)_Var13._M_i,*(size_t *)_Stack_3a0._M_i);
    if (iVar10 != 0) goto LAB_0011312d;
    pcVar52 = *(char **)(_Var11._M_i + 0x38);
    _Var13._M_i = (__int_type)((fdb_kvs_handle *)_Var17._M_i)->staletree;
    iVar10 = bcmp(pcVar52,(void *)_Var13._M_i,(size_t)*(fdb_custom_cmp_variable *)(_Var11._M_i + 8))
    ;
    pfVar18 = (fdb_kvs_handle *)_Var17._M_i;
    if (iVar10 != 0) goto LAB_00113148;
    pcVar52 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var11._M_i + 0x40))->
                      seqtree;
    _Var13._M_i = (__int_type)(((fdb_kvs_handle *)_Var17._M_i)->field_6).seqtree;
    iVar10 = bcmp(pcVar52,(void *)_Var13._M_i,(size_t)*(void **)(_Var11._M_i + 0x10));
    if (iVar10 != 0) goto LAB_0011313d;
    fdb_doc_free((fdb_doc *)_Var11._M_i);
    _Stack_3a0._M_i = 0;
    pcVar57 = &((fdb_kvs_config *)&((filemgr *)pcVar57)->filename)->field_0x1;
    fVar9 = fdb_iterator_next((fdb_iterator *)auStack_3b0._8_8_);
    pfVar18 = (fdb_kvs_handle *)auStack_3b0._8_8_;
    _Var19._M_i = _Var11._M_i;
  } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
  puVar8 = auStack_840;
  if ((uint8_t *)pcVar57 != (uint8_t *)0xa) goto LAB_0011325f;
  _Var11._M_i = (__int_type)(apbStack_408[2]->alc_list).tail;
  sVar12 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar9 = fdb_iterator_seek((fdb_iterator *)pfVar18,(void *)_Var11._M_i,sVar12,'\0');
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113264;
  pcVar57 = (char *)0x3;
  _Var17._M_i = _Var11._M_i;
  do {
    fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
    _Var11._M_i = _Stack_3a0._M_i;
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011315e;
    pcVar52 = *(char **)(_Stack_3a0._M_i + 0x20);
    pfVar18 = (fdb_kvs_handle *)
              apbStack_408[(long)&((filemgr *)((long)pcVar57 + -0x2f0))->field_0x2ef];
    _Var13._M_i = (__int_type)pfVar18->op_stats;
    iVar10 = bcmp(pcVar52,(void *)_Var13._M_i,*(size_t *)_Stack_3a0._M_i);
    if (iVar10 != 0) goto LAB_00113153;
    pcVar52 = *(char **)(_Var11._M_i + 0x38);
    _Var13._M_i = (__int_type)pfVar18->staletree;
    iVar10 = bcmp(pcVar52,(void *)_Var13._M_i,(size_t)*(fdb_custom_cmp_variable *)(_Var11._M_i + 8))
    ;
    if (iVar10 != 0) goto LAB_0011316e;
    pcVar52 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var11._M_i + 0x40))->
                      seqtree;
    _Var13._M_i = (__int_type)(pfVar18->field_6).seqtree;
    iVar10 = bcmp(pcVar52,(void *)_Var13._M_i,(size_t)*(void **)(_Var11._M_i + 0x10));
    if (iVar10 != 0) goto LAB_00113163;
    fdb_doc_free((fdb_doc *)_Var11._M_i);
    _Stack_3a0._M_i = 0;
    pcVar57 = &((fdb_kvs_config *)&((filemgr *)pcVar57)->filename)->field_0x1;
    fVar9 = fdb_iterator_next((fdb_iterator *)auStack_3b0._8_8_);
    _Var17._M_i = _Var11._M_i;
  } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
  puVar8 = auStack_840;
  if ((uint8_t *)pcVar57 != (uint8_t *)0xa) goto LAB_00113269;
  pfVar18 = (fdb_kvs_handle *)(auStack_3b0 + 8);
  fdb_iterator_close((fdb_iterator *)auStack_3b0._8_8_);
  _Var11._M_i = (__int_type)&abStack_740[4].alc_list.tail;
  sprintf((char *)_Var11._M_i,"key%d",4);
  _Var13._M_i = (__int_type)abStack_740;
  sprintf((char *)_Var13._M_i,"key%d",8);
  pcVar52 = (char *)auStack_3b0._0_8_;
  pcVar57 = (char *)strlen((char *)_Var11._M_i);
  sVar12 = strlen((char *)_Var13._M_i);
  uStack_858 = 0x112be2;
  fVar9 = fdb_iterator_init((fdb_kvs_handle *)pcVar52,(fdb_iterator **)pfVar18,(void *)_Var11._M_i,
                            (size_t)pcVar57,(void *)_Var13._M_i,sVar12,2);
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011326e;
  fVar9 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_3b0._8_8_);
  puVar8 = auStack_840;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113273;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var20._M_i = _Stack_3a0._M_i;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113278;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)(pbStack_3d0->alc_list).tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  puVar8 = auStack_840;
  _Var13._M_i = (__int_type)pbStack_3d0;
  if (iVar10 != 0) goto LAB_0011327d;
  _Var11._M_i = *(__int_type *)(_Var20._M_i + 0x38);
  pcVar52 = (char *)pbStack_3d0->file;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8));
  if (iVar10 != 0) goto LAB_00113288;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
  pcVar52 = (char *)pbStack_3d0->log_callback;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var20._M_i + 0x10));
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_00113293;
  fdb_doc_free((fdb_doc *)_Var20._M_i);
  _Stack_3a0._M_i = 0;
  fVar9 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_3b0._8_8_);
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011329e;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var17._M_i = _Stack_3a0._M_i;
  puVar8 = auStack_840;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001132a3;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)(apbStack_408[3]->alc_list).tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  _Var13._M_i = (__int_type)apbStack_408[3];
  if (iVar10 != 0) goto LAB_001132a8;
  _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
  pcVar52 = (char *)apbStack_408[3]->file;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_001132b3;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
  pcVar52 = (char *)apbStack_408[3]->log_callback;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var17._M_i + 0x10));
  if (iVar10 != 0) goto LAB_001132be;
  fdb_doc_free((fdb_doc *)_Var17._M_i);
  _Stack_3a0._M_i = 0;
  fVar9 = fdb_iterator_close((fdb_iterator *)auStack_3b0._8_8_);
  puVar8 = auStack_840;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001132c9;
  uStack_858 = 0x112d56;
  fVar9 = fdb_iterator_init((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_iterator **)(auStack_3b0 + 8),
                            (void *)0x0,0,(void *)0x0,0,0);
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001132ce;
  fVar9 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_3b0._8_8_);
  puVar8 = auStack_840;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001132d3;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var13._M_i = _Stack_3a0._M_i;
  doc_02 = (char *)pbStack_3c8;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001132d8;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)(pbStack_3c8->alc_list).tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_001132dd;
  _Var11._M_i = *(__int_type *)(_Var13._M_i + 0x38);
  pcVar52 = (char *)((btreeblk_handle *)doc_02)->file;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var13._M_i + 8));
  if (iVar10 != 0) goto LAB_001132e8;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var13._M_i + 0x40))->seqtree;
  pcVar52 = (char *)((btreeblk_handle *)doc_02)->log_callback;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var13._M_i + 0x10));
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_001132f3;
  fdb_doc_free((fdb_doc *)_Var13._M_i);
  _Stack_3a0._M_i = 0;
  fVar9 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_3b0._8_8_);
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001132fe;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var20._M_i = _Stack_3a0._M_i;
  puVar8 = auStack_840;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113303;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)((list *)(auStack_428._24_8_ + 0x18))->tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  doc_02 = (char *)auStack_428._24_8_;
  if (iVar10 != 0) goto LAB_00113308;
  _Var11._M_i = *(__int_type *)(_Var20._M_i + 0x38);
  pcVar52 = *(char **)(auStack_428._24_8_ + 0x38);
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var20._M_i + 8));
  puVar8 = auStack_840;
  if (iVar10 != 0) goto LAB_00113313;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var20._M_i + 0x40))->seqtree;
  pcVar52 = *(char **)(auStack_428._24_8_ + 0x40);
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var20._M_i + 0x10));
  if (iVar10 != 0) goto LAB_0011331e;
  fdb_doc_free((fdb_doc *)_Var20._M_i);
  _Stack_3a0._M_i = 0;
  _Var20._M_i = (__int_type)afStack_107c0;
  memset((void *)_Var20._M_i,0xff,0xff80);
  fVar9 = fdb_iterator_seek((fdb_iterator *)auStack_3b0._8_8_,(void *)_Var20._M_i,0xff80,'\x01');
  pfVar48 = (fdb_kvs_handle *)_Var20._M_i;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113329;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var13._M_i = _Stack_3a0._M_i;
  pfVar18 = (fdb_kvs_handle *)_Var20._M_i;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011332e;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)(pbStack_3c8->alc_list).tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  doc_02 = (char *)pbStack_3c8;
  if (iVar10 != 0) goto LAB_00113333;
  _Var11._M_i = *(__int_type *)(_Var13._M_i + 0x38);
  pcVar52 = (char *)pbStack_3c8->file;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var13._M_i + 8));
  if (iVar10 != 0) goto LAB_0011333e;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var13._M_i + 0x40))->seqtree;
  pcVar52 = (char *)pbStack_3c8->log_callback;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var13._M_i + 0x10));
  if (iVar10 != 0) goto LAB_00113349;
  fdb_doc_free((fdb_doc *)_Var13._M_i);
  _Stack_3a0._M_i = 0;
  fVar9 = fdb_iterator_close((fdb_iterator *)auStack_3b0._8_8_);
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113354;
  pfVar18 = (fdb_kvs_handle *)0xfffffffffffffffe;
  do {
    fVar9 = fdb_del((fdb_kvs_handle *)auStack_3b0._0_8_,
                    (fdb_doc *)apbStack_408[(long)&(pfVar18->kvs_config).field_0x1]);
    _Var13._M_i = (__int_type)pbStack_3c8;
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00113179;
    pfVar18 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x2;
  } while (pfVar18 < (undefined1 *)0x8);
  fdb_commit((fdb_file_handle *)auStack_3b8,'\0');
  fdb_iterator_init((fdb_kvs_handle *)auStack_3b0._0_8_,(fdb_iterator **)(auStack_3b0 + 8),
                    (void *)0x0,0,(void *)0x0,0,0);
  _Var13._M_i = auStack_3b0._8_8_;
  _Stack_3a0._M_i = 0;
  _Var11._M_i = (__int_type)(apbStack_408[1]->alc_list).tail;
  sVar12 = strlen((char *)&abStack_740[4].alc_list.tail);
  fVar9 = fdb_iterator_seek((fdb_iterator *)_Var13._M_i,(void *)_Var11._M_i,sVar12,'\0');
  if (fVar9 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00113359;
  fVar9 = fdb_iterator_get((fdb_iterator *)auStack_3b0._8_8_,(fdb_doc **)&_Stack_3a0);
  _Var17._M_i = _Stack_3a0._M_i;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011335e;
  _Var11._M_i = *(__int_type *)(_Stack_3a0._M_i + 0x20);
  pcVar52 = (char *)(apbStack_408[1]->alc_list).tail;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,*(size_t *)_Stack_3a0._M_i);
  doc_02 = (char *)apbStack_408[1];
  if (iVar10 != 0) goto LAB_00113363;
  _Var11._M_i = *(__int_type *)(_Var17._M_i + 0x38);
  pcVar52 = (char *)apbStack_408[1]->file;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(fdb_custom_cmp_variable *)(_Var17._M_i + 8));
  if (iVar10 != 0) goto LAB_0011336e;
  _Var11._M_i = (__int_type)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(_Var17._M_i + 0x40))->seqtree;
  pcVar52 = (char *)apbStack_408[1]->log_callback;
  pfVar53 = (filemgr *)pcVar52;
  iVar10 = bcmp((void *)_Var11._M_i,pcVar52,(size_t)*(void **)(_Var17._M_i + 0x10));
  uVar62 = SUB84(pfVar53,0);
  if (iVar10 != 0) goto LAB_00113379;
  fdb_doc_free((fdb_doc *)_Var17._M_i);
  _Stack_3a0._M_i = 0;
  fVar9 = fdb_iterator_close((fdb_iterator *)auStack_3b0._8_8_);
  uVar16 = (uint)auStack_3b0._8_8_;
  if (fVar9 == FDB_RESULT_SUCCESS) {
    fdb_kvs_close((fdb_kvs_handle *)_Stack_3c0._M_i);
    fdb_kvs_close((fdb_kvs_handle *)auStack_3b0._0_8_);
    fdb_close((fdb_file_handle *)auStack_3b8);
    lVar54 = 0;
    do {
      fdb_doc_free((fdb_doc *)apbStack_408[lVar54 + -1]);
      lVar54 = lVar54 + 1;
    } while (lVar54 != 10);
    fdb_shutdown();
    memleak_end();
    pcVar52 = "%s PASSED\n";
    if (iterator_seek_test()::__test_pass != '\0') {
      pcVar52 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar52,"iterator seek test");
    return;
  }
  goto LAB_00113384;
LAB_00115083:
  fconfig_00 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
  pcVar50 = (char *)(ulong)uVar16;
  pcVar52 = "key%06d";
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115093;
  iterator_complete_test();
LAB_00115093:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150a3;
  iterator_complete_test();
LAB_001150a3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150b3;
  iterator_complete_test();
LAB_001150b3:
  doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150c3;
  iterator_complete_test();
LAB_001150c3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150d3;
  iterator_complete_test();
LAB_001150d3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150e3;
  iterator_complete_test();
LAB_001150e3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150f3;
  iterator_complete_test();
LAB_001150f3:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150f8;
  iterator_complete_test();
LAB_001150f8:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1150fd;
  iterator_complete_test();
LAB_001150fd:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115102;
  iterator_complete_test();
LAB_00115102:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115107;
  iterator_complete_test();
LAB_00115107:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11510c;
  iterator_complete_test();
LAB_0011510c:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115111;
  iterator_complete_test();
LAB_00115111:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115116;
  iterator_complete_test();
LAB_00115116:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11511b;
  iterator_complete_test();
LAB_0011511b:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115120;
  iterator_complete_test();
LAB_00115120:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115125;
  iterator_complete_test();
LAB_00115125:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11512a;
  iterator_complete_test();
LAB_0011512a:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11512f;
  iterator_complete_test();
LAB_0011512f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11513f;
  iterator_complete_test();
LAB_0011513f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11514f;
  iterator_complete_test();
LAB_0011514f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11515f;
  iterator_complete_test();
LAB_0011515f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11516f;
  iterator_complete_test();
  pfVar53 = (filemgr *)pcVar57;
LAB_0011516f:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115174;
  iterator_complete_test();
LAB_00115174:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115179;
  iterator_complete_test();
  pfVar58 = pfVar53;
LAB_00115179:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11517e;
  iterator_complete_test();
  pfVar53 = pfVar58;
LAB_0011517e:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115183;
  iterator_complete_test();
LAB_00115183:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115188;
  iterator_complete_test();
  pfVar48 = pfVar18;
LAB_00115188:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11518d;
  iterator_complete_test();
LAB_0011518d:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115192;
  iterator_complete_test();
LAB_00115192:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115197;
  iterator_complete_test();
  pcVar57 = (char *)pfVar53;
  pfVar18 = pfVar48;
LAB_00115197:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11519c;
  iterator_complete_test();
LAB_0011519c:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151a1;
  iterator_complete_test();
  goto LAB_001151a1;
LAB_00115708:
  (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115715;
  iterator_extreme_key_test();
LAB_00115715:
  (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115722;
  iterator_extreme_key_test();
LAB_00115722:
  pfVar18 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
  pcVar52 = "0xff length %d";
  doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask;
  (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11572f;
  pfVar48 = (fdb_kvs_handle *)doc_02;
  iterator_extreme_key_test();
  goto LAB_0011572f;
LAB_0011312d:
  iterator_seek_test();
  pfVar18 = (fdb_kvs_handle *)_Var17._M_i;
  _Var19._M_i = _Var11._M_i;
LAB_00113138:
  _Var11._M_i = _Var19._M_i;
  iterator_seek_test();
LAB_0011313d:
  iterator_seek_test();
LAB_00113148:
  iterator_seek_test();
LAB_00113153:
  iterator_seek_test();
  _Var17._M_i = _Var11._M_i;
LAB_0011315e:
  _Var11._M_i = _Var17._M_i;
  iterator_seek_test();
LAB_00113163:
  iterator_seek_test();
LAB_0011316e:
  iterator_seek_test();
LAB_00113179:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11317e;
  iterator_seek_test();
  pfVar22 = (fdb_kvs_handle *)_Var20._M_i;
LAB_0011317e:
  *(undefined8 *)((long)pfVar22 + -8) = 0x113183;
  iterator_seek_test();
  puVar8 = (undefined1 *)pfVar22;
LAB_00113183:
  puVar23 = puVar8;
  *(undefined8 *)(puVar23 + -8) = 0x113188;
  iterator_seek_test();
LAB_00113188:
  pbVar55 = (btreeblk_handle *)_Var13._M_i;
  _Var17._M_i = (__int_type)pfVar18;
  *(undefined8 *)(puVar23 + -8) = 0x11318d;
  iterator_seek_test();
  puVar8 = puVar23;
LAB_0011318d:
  puVar24 = puVar8;
  *(undefined8 *)(puVar24 + -8) = 0x113198;
  iterator_seek_test();
LAB_00113198:
  *(undefined8 *)(puVar24 + -8) = 0x1131a3;
  iterator_seek_test();
  puVar8 = puVar24;
LAB_001131a3:
  puVar25 = puVar8;
  *(undefined8 *)(puVar25 + -8) = 0x1131ae;
  iterator_seek_test();
LAB_001131ae:
  *(undefined8 *)(puVar25 + -8) = 0x1131b3;
  iterator_seek_test();
  puVar8 = puVar25;
LAB_001131b3:
  pbVar56 = pbVar55;
  puVar26 = puVar8;
  _Var13._M_i = _Var17._M_i;
  *(undefined8 *)(puVar26 + -8) = 0x1131b8;
  iterator_seek_test();
LAB_001131b8:
  *(undefined8 *)(puVar26 + -8) = 0x1131c3;
  iterator_seek_test();
  puVar8 = puVar26;
LAB_001131c3:
  puVar27 = puVar8;
  *(undefined8 *)(puVar27 + -8) = 0x1131ce;
  iterator_seek_test();
LAB_001131ce:
  *(undefined8 *)(puVar27 + -8) = 0x1131d9;
  iterator_seek_test();
  puVar8 = puVar27;
LAB_001131d9:
  puVar28 = puVar8;
  *(undefined8 *)(puVar28 + -8) = 0x1131de;
  iterator_seek_test();
LAB_001131de:
  pbVar55 = pbVar56;
  _Var17._M_i = _Var13._M_i;
  *(undefined8 *)(puVar28 + -8) = 0x1131e3;
  iterator_seek_test();
  puVar8 = puVar28;
LAB_001131e3:
  puVar29 = puVar8;
  *(undefined8 *)(puVar29 + -8) = 0x1131ee;
  iterator_seek_test();
LAB_001131ee:
  *(undefined8 *)(puVar29 + -8) = 0x1131f9;
  iterator_seek_test();
  puVar8 = puVar29;
LAB_001131f9:
  puVar30 = puVar8;
  *(undefined8 *)(puVar30 + -8) = 0x113204;
  iterator_seek_test();
LAB_00113204:
  *(undefined8 *)(puVar30 + -8) = 0x113209;
  iterator_seek_test();
  puVar8 = puVar30;
LAB_00113209:
  pbVar56 = pbVar55;
  puVar31 = puVar8;
  _Var19._M_i = _Var17._M_i;
  *(undefined8 *)(puVar31 + -8) = 0x11320e;
  iterator_seek_test();
LAB_0011320e:
  *(undefined8 *)(puVar31 + -8) = 0x113219;
  iterator_seek_test();
  puVar8 = puVar31;
LAB_00113219:
  puVar32 = puVar8;
  *(undefined8 *)(puVar32 + -8) = 0x113224;
  iterator_seek_test();
LAB_00113224:
  *(undefined8 *)(puVar32 + -8) = 0x11322f;
  iterator_seek_test();
  puVar8 = puVar32;
LAB_0011322f:
  puVar33 = puVar8;
  *(undefined8 *)(puVar33 + -8) = 0x113234;
  iterator_seek_test();
LAB_00113234:
  _Var13._M_i = (__int_type)pbVar56;
  _Var17._M_i = _Var19._M_i;
  *(undefined8 *)(puVar33 + -8) = 0x113239;
  iterator_seek_test();
  puVar8 = puVar33;
LAB_00113239:
  puVar34 = puVar8;
  *(undefined8 *)(puVar34 + -8) = 0x113244;
  iterator_seek_test();
LAB_00113244:
  *(undefined8 *)(puVar34 + -8) = 0x11324f;
  iterator_seek_test();
  puVar8 = puVar34;
LAB_0011324f:
  puVar35 = puVar8;
  *(undefined8 *)(puVar35 + -8) = 0x11325a;
  iterator_seek_test();
LAB_0011325a:
  *(undefined8 *)(puVar35 + -8) = 0x11325f;
  iterator_seek_test();
  puVar8 = puVar35;
LAB_0011325f:
  puVar36 = puVar8;
  pfVar18 = (fdb_kvs_handle *)_Var17._M_i;
  *(undefined8 *)(puVar36 + -8) = 0x113264;
  iterator_seek_test();
LAB_00113264:
  *(undefined8 *)(puVar36 + -8) = 0x113269;
  iterator_seek_test();
  puVar8 = puVar36;
LAB_00113269:
  puVar37 = puVar8;
  *(undefined8 *)(puVar37 + -8) = 0x11326e;
  iterator_seek_test();
LAB_0011326e:
  *(undefined8 *)(puVar37 + -8) = 0x113273;
  iterator_seek_test();
  puVar8 = puVar37;
LAB_00113273:
  puVar38 = puVar8;
  *(undefined8 *)(puVar38 + -8) = 0x113278;
  iterator_seek_test();
LAB_00113278:
  _Var20._M_i = (__int_type)pfVar18;
  *(undefined8 *)(puVar38 + -8) = 0x11327d;
  iterator_seek_test();
  puVar8 = puVar38;
LAB_0011327d:
  puVar39 = puVar8;
  *(undefined8 *)(puVar39 + -8) = 0x113288;
  iterator_seek_test();
LAB_00113288:
  *(undefined8 *)(puVar39 + -8) = 0x113293;
  iterator_seek_test();
  puVar8 = puVar39;
LAB_00113293:
  puVar40 = puVar8;
  *(undefined8 *)(puVar40 + -8) = 0x11329e;
  iterator_seek_test();
LAB_0011329e:
  *(undefined8 *)(puVar40 + -8) = 0x1132a3;
  iterator_seek_test();
  puVar8 = puVar40;
LAB_001132a3:
  puVar41 = puVar8;
  _Var17._M_i = _Var20._M_i;
  *(undefined8 *)(puVar41 + -8) = 0x1132a8;
  iterator_seek_test();
LAB_001132a8:
  *(undefined8 *)(puVar41 + -8) = 0x1132b3;
  iterator_seek_test();
  puVar8 = puVar41;
LAB_001132b3:
  puVar42 = puVar8;
  *(undefined8 *)(puVar42 + -8) = 0x1132be;
  iterator_seek_test();
LAB_001132be:
  *(undefined8 *)(puVar42 + -8) = 0x1132c9;
  iterator_seek_test();
  puVar8 = puVar42;
LAB_001132c9:
  puVar43 = puVar8;
  *(undefined8 *)(puVar43 + -8) = 0x1132ce;
  iterator_seek_test();
LAB_001132ce:
  *(undefined8 *)(puVar43 + -8) = 0x1132d3;
  iterator_seek_test();
  puVar8 = puVar43;
LAB_001132d3:
  puVar44 = puVar8;
  *(undefined8 *)(puVar44 + -8) = 0x1132d8;
  iterator_seek_test();
  apbStack_408[3] = (btreeblk_handle *)_Var13._M_i;
LAB_001132d8:
  doc_02 = (char *)apbStack_408[3];
  _Var13._M_i = _Var17._M_i;
  *(undefined8 *)(puVar44 + -8) = 0x1132dd;
  iterator_seek_test();
  puVar8 = puVar44;
LAB_001132dd:
  puVar45 = puVar8;
  *(undefined8 *)(puVar45 + -8) = 0x1132e8;
  iterator_seek_test();
LAB_001132e8:
  *(undefined8 *)(puVar45 + -8) = 0x1132f3;
  iterator_seek_test();
  puVar8 = puVar45;
LAB_001132f3:
  puVar46 = puVar8;
  *(undefined8 *)(puVar46 + -8) = 0x1132fe;
  iterator_seek_test();
LAB_001132fe:
  *(undefined8 *)(puVar46 + -8) = 0x113303;
  iterator_seek_test();
  puVar8 = puVar46;
LAB_00113303:
  puVar47 = puVar8;
  _Var20._M_i = _Var13._M_i;
  *(undefined8 *)(puVar47 + -8) = 0x113308;
  iterator_seek_test();
LAB_00113308:
  *(undefined8 *)(puVar47 + -8) = 0x113313;
  iterator_seek_test();
  puVar8 = puVar47;
LAB_00113313:
  pfVar48 = (fdb_kvs_handle *)puVar8;
  *(undefined8 *)((long)pfVar48 + -8) = 0x11331e;
  iterator_seek_test();
LAB_0011331e:
  *(undefined8 *)((long)pfVar48 + -8) = 0x113329;
  iterator_seek_test();
LAB_00113329:
  pfVar48[-1].bub_ctx.handle = (fdb_kvs_handle *)0x11332e;
  iterator_seek_test();
  pfVar18 = (fdb_kvs_handle *)_Var20._M_i;
  _Var20._M_i = (__int_type)pfVar48;
LAB_0011332e:
  _Var13._M_i = (__int_type)pfVar18;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113333;
  iterator_seek_test();
LAB_00113333:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11333e;
  iterator_seek_test();
LAB_0011333e:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113349;
  iterator_seek_test();
LAB_00113349:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113354;
  iterator_seek_test();
LAB_00113354:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113359;
  iterator_seek_test();
LAB_00113359:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11335e;
  iterator_seek_test();
LAB_0011335e:
  _Var17._M_i = _Var13._M_i;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113363;
  iterator_seek_test();
LAB_00113363:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x11336e;
  iterator_seek_test();
LAB_0011336e:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113379;
  iterator_seek_test();
LAB_00113379:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)0x113384;
  pfVar18 = (fdb_kvs_handle *)_Var11._M_i;
  pfVar53 = (filemgr *)pcVar52;
  iterator_seek_test();
  uVar16 = (uint)pfVar53;
  uVar62 = SUB84(pfVar18,0);
LAB_00113384:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle =
       (fdb_kvs_handle *)iterator_complete_test;
  iterator_seek_test();
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).handle = (fdb_kvs_handle *)&aStack_370;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).space_used = (uint64_t)pcVar52;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).num_entries = _Var11._M_i;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x208))->bub_ctx).entries = (list *)pcVar57;
  *(char **)&((fdb_kvs_handle *)(_Var20._M_i + -0x208))->num_iterators = doc_02;
  ((fdb_kvs_handle *)(_Var20._M_i + -0x208))->node = (kvs_opened_node *)_Var17._M_i;
  *(undefined4 *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
       = uVar62;
  pfVar18 = (fdb_kvs_handle *)(ulong)uVar16;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133b0;
  gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x208))->config).compaction_cb_mask,
               (__timezone_ptr_t)0x0);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
  ((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node = (kvs_opened_node *)0x202066722d206d72;
  *(undefined8 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->num_iterators = 0x726f746172657469;
  *(undefined8 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->field_0x1e7 = 0x2a747365745f72;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133de;
  system((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133e3;
  memleak_start();
  fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x208))->config).max_writer_lock_prob;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1133f3;
  fdb_get_default_config();
  *(undefined4 *)
   ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x208))->config).num_bgflusher_threads + 4) = 1;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113407;
  fdb_get_default_kvs_config();
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11341b;
  fVar9 = fdb_open((fdb_file_handle **)
                   ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4),
                   "./iterator_test",(fdb_config *)fconfig_00);
  if (fVar9 != FDB_RESULT_SUCCESS) {
LAB_001151a6:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151ab;
    iterator_complete_test();
LAB_001151ab:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151b0;
    iterator_complete_test();
LAB_001151b0:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151b5;
    iterator_complete_test();
LAB_001151b5:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151ba;
    iterator_complete_test();
LAB_001151ba:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151bf;
    iterator_complete_test();
LAB_001151bf:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151c4;
    iterator_complete_test();
LAB_001151c4:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151c9;
    iterator_complete_test();
LAB_001151c9:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151ce;
    iterator_complete_test();
LAB_001151ce:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151d3;
    iterator_complete_test();
LAB_001151d3:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151d8;
    iterator_complete_test();
LAB_001151d8:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151dd;
    iterator_complete_test();
LAB_001151dd:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151e2;
    iterator_complete_test();
LAB_001151e2:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151e7;
    iterator_complete_test();
LAB_001151e7:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151ec;
    iterator_complete_test();
LAB_001151ec:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151f1;
    iterator_complete_test();
LAB_001151f1:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151f6;
    iterator_complete_test();
LAB_001151f6:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151fb;
    iterator_complete_test();
LAB_001151fb:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115200;
    iterator_complete_test();
LAB_00115200:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115205;
    iterator_complete_test();
LAB_00115205:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115215;
    iterator_complete_test();
LAB_00115215:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11521a;
    iterator_complete_test();
LAB_0011521a:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11521f;
    iterator_complete_test();
LAB_0011521f:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115224;
    iterator_complete_test();
LAB_00115224:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115229;
    iterator_complete_test();
LAB_00115229:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115239;
    iterator_complete_test();
LAB_00115239:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11523e;
    iterator_complete_test();
LAB_0011523e:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115243;
    iterator_complete_test();
LAB_00115243:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115248;
    iterator_complete_test();
    pfVar53 = (filemgr *)pcVar57;
LAB_00115248:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11524d;
    iterator_complete_test();
LAB_0011524d:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115252;
    iterator_complete_test();
LAB_00115252:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115257;
    iterator_complete_test();
LAB_00115257:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11525c;
    iterator_complete_test();
LAB_0011525c:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115261;
    iterator_complete_test();
LAB_00115261:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115266;
    iterator_complete_test();
LAB_00115266:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11526b;
    iterator_complete_test();
    pfVar48 = pfVar18;
LAB_0011526b:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115270;
    iterator_complete_test();
LAB_00115270:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115275;
    iterator_complete_test();
    pfVar18 = pfVar48;
LAB_00115275:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11527a;
    iterator_complete_test();
LAB_0011527a:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11527f;
    iterator_complete_test();
LAB_0011527f:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115284;
    iterator_complete_test();
LAB_00115284:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115289;
    iterator_complete_test();
LAB_00115289:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11528e;
    iterator_complete_test();
LAB_0011528e:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115293;
    iterator_complete_test();
LAB_00115293:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115298;
    iterator_complete_test();
LAB_00115298:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
         iterator_extreme_key_test;
    iterator_complete_test();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = pcVar52;
    *(fdb_kvs_handle **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_mask =
         pfVar18;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb =
         (fdb_compaction_callback)pfVar53;
    *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_wal_partitions = doc_02;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).prefetch_duration = (uint64_t)fconfig_00;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1152b9;
    gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).num_wal_partitions
                 ,(__timezone_ptr_t)0x0);
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).durability_opt = '\0';
    *(undefined2 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).field_0x22 = 0;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).flags = 0;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x820))->filename = (char *)0x202066722d206d72;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x820))->txn = (fdb_txn *)0x726f746172657469;
    *(undefined8 *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x820))->txn + 7) = 0x2a747365745f72;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1152e7;
    system((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x820))->filename);
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1152ec;
    memleak_start();
    fconfig_01 = (atomic<unsigned_char> *)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xa28))->config).compaction_cb_mask;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1152fc;
    fdb_get_default_config();
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115306;
    fdb_get_default_kvs_config();
    pfVar48 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_minimum_filesize;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11531a;
    fVar9 = fdb_open((fdb_file_handle **)pfVar48,"./iterator_test",(fdb_config *)fconfig_01);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      pfVar48 = (fdb_kvs_handle *)
                (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115338;
      fVar9 = fdb_kvs_open((fdb_file_handle *)pfVar48,
                           (fdb_kvs_handle **)
                           &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                            compaction_buf_maxsize,(char *)0x0,
                           (fdb_kvs_config *)
                           &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                            compactor_sleep_duration);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115734;
      fconfig_01 = &((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->handle_busy;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11535a;
      memset(fconfig_01,0xff,0x100);
      uVar51 = 1;
      pcVar52 = "0xff length %d";
      doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask;
      do {
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11537c;
        sprintf(doc_02,"0xff length %d",uVar51 & 0xffffffff);
        pfVar53 = *(filemgr **)
                   &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_buf_maxsize;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115389;
        sVar12 = strlen(doc_02);
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11539e;
        fdb_set_kv((fdb_kvs_handle *)pfVar53,fconfig_01,uVar51,doc_02,sVar12 + 1);
        uVar51 = uVar51 + 1;
      } while (uVar51 != 0x1e);
      pfVar2 = (fdb_file_handle *)
               (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1153b6;
      fdb_commit(pfVar2,'\x01');
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold = 0;
      pfVar48 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1153d4;
      fVar9 = fdb_doc_create((fdb_doc **)pfVar48,(void *)0x0,0,(void *)0x0,0,(void *)0x0,
                             (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold);
      pfVar18 = (fdb_kvs_handle *)0x1e;
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115739;
      lVar54 = *(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      *(uint16_t **)(lVar54 + 0x20) =
           &(((fdb_kvs_handle *)(_Var20._M_i + -0x820))->config).num_wal_partitions;
      *(undefined8 *)(lVar54 + 0x38) = 0;
      *(fdb_txn ***)(lVar54 + 0x40) = &((fdb_kvs_handle *)(_Var20._M_i + -0xa28))->txn;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_buf_maxsize;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold = 0;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115421;
      fVar9 = fdb_iterator_init(pfVar48,(fdb_iterator **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                         wal_flush_before_commit,(void *)0x0,0,(void *)0x0,0,
                                (fdb_iterator_opt_t)
                                (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011573e;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115433;
      fVar9 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar48);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115743;
      fconfig_01 = (atomic<unsigned_char> *)0x1d;
      do {
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11545e;
        fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                         seqtree_opt);
        if (fVar9 != FDB_RESULT_SUCCESS) break;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115471;
        sprintf((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask,
                "0xff length %d",fconfig_01);
        sVar12 = *(size_t *)
                  (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt + 0x10
                  );
        pfVar53 = *(filemgr **)
                   (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                   0x40);
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115489;
        iVar10 = bcmp(pfVar53,&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                               compaction_cb_mask,sVar12);
        if (iVar10 != 0) {
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115708;
          iterator_extreme_key_test();
          goto LAB_00115708;
        }
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11549b;
        fVar9 = fdb_iterator_prev(pfVar3);
        fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 - 1);
      } while (fVar9 == FDB_RESULT_SUCCESS);
      pfVar3 = *(fdb_iterator **)
                &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1154bd;
      fVar9 = fdb_iterator_seek(pfVar3,&((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->handle_busy,8,
                                '\x01');
      if (fVar9 == FDB_RESULT_SUCCESS) {
        fconfig_01 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1154e4;
          fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                           seqtree_opt);
          if (fVar9 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1154f7;
          sprintf((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask,
                  "0xff length %d",fconfig_01);
          sVar12 = *(size_t *)
                    (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                    0x10);
          pfVar53 = *(filemgr **)
                     (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                     0x40);
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11550f;
          iVar10 = bcmp(pfVar53,&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                 compaction_cb_mask,sVar12);
          if (iVar10 != 0) goto LAB_00115715;
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115521;
          fVar9 = fdb_iterator_prev(pfVar3);
          fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 - 1);
        } while (fVar9 == FDB_RESULT_SUCCESS);
      }
      pfVar3 = *(fdb_iterator **)
                &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115543;
      fVar9 = fdb_iterator_seek(pfVar3,&((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->handle_busy,8,
                                '\x01');
      if (fVar9 == FDB_RESULT_SUCCESS) {
        fconfig_01 = (atomic<unsigned_char> *)0x8;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11556a;
          fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                           seqtree_opt);
          if (fVar9 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11557d;
          sprintf((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask,
                  "0xff length %d",fconfig_01);
          sVar12 = *(size_t *)
                    (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                    0x10);
          pfVar53 = *(filemgr **)
                     (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                     0x40);
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115595;
          iVar10 = bcmp(pfVar53,&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                 compaction_cb_mask,sVar12);
          if (iVar10 != 0) goto LAB_00115722;
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
          (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1155a7;
          fVar9 = fdb_iterator_next(pfVar3);
          fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 + 1);
        } while (fVar9 == FDB_RESULT_SUCCESS);
      }
      pfVar18 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask;
      pcVar52 = "0xff length %d";
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1155b7;
      fVar9 = fdb_iterator_close((fdb_iterator *)pfVar48);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115748;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_buf_maxsize;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold = 0;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1155e7;
      fVar9 = fdb_iterator_init(pfVar48,(fdb_iterator **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).
                                         wal_flush_before_commit,(void *)0x0,0,
                                &((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->handle_busy,0x100,
                                (fdb_iterator_opt_t)
                                (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_threshold);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011574d;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1155f9;
      fVar9 = fdb_iterator_seek_to_max((fdb_iterator *)pfVar48);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115752;
      fconfig_01 = (atomic<unsigned_char> *)0x1d;
      pfVar18 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      pcVar52 = "0xff length %d";
      doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_cb_mask;
      do {
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115624;
        fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)pfVar18);
        if (fVar9 != FDB_RESULT_SUCCESS) break;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115637;
        sprintf(doc_02,"0xff length %d",fconfig_01);
        sVar12 = *(size_t *)
                  (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt + 0x10
                  );
        pfVar53 = *(filemgr **)
                   (*(long *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt +
                   0x40);
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11564f;
        iVar10 = bcmp(pfVar53,doc_02,sVar12);
        if (iVar10 != 0) goto LAB_00115708;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115661;
        fVar9 = fdb_iterator_prev(pfVar3);
        fconfig_01 = (atomic<unsigned_char> *)(ulong)((int)fconfig_01 - 1);
      } while (fVar9 == FDB_RESULT_SUCCESS);
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).wal_flush_before_commit;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115671;
      fVar9 = fdb_iterator_close((fdb_iterator *)pfVar48);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115757;
      pfVar48 = (fdb_kvs_handle *)
                (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).compaction_minimum_filesize;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115683;
      fVar9 = fdb_close((fdb_file_handle *)pfVar48);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011575c;
      pfVar48 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).seqtree_opt;
      pfVar48->op_stats = (kvs_ops_stat *)0x0;
      (pfVar48->field_6).seqtree = (btree *)0x0;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11569f;
      fVar9 = fdb_doc_free((fdb_doc *)pfVar48);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115761;
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1156ac;
      fVar9 = fdb_shutdown();
      if (fVar9 == FDB_RESULT_SUCCESS) {
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1156b9;
        memleak_end();
        pcVar52 = "%s PASSED\n";
        if (iterator_extreme_key_test()::__test_pass != '\0') {
          pcVar52 = "%s FAILED\n";
        }
        (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x1156ea;
        fprintf(_stderr,pcVar52,"iterator extreme key test");
        return;
      }
    }
    else {
LAB_0011572f:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115734;
      iterator_extreme_key_test();
LAB_00115734:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115739;
      iterator_extreme_key_test();
LAB_00115739:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11573e;
      iterator_extreme_key_test();
LAB_0011573e:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115743;
      iterator_extreme_key_test();
LAB_00115743:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115748;
      iterator_extreme_key_test();
LAB_00115748:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11574d;
      iterator_extreme_key_test();
LAB_0011574d:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115752;
      iterator_extreme_key_test();
LAB_00115752:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115757;
      iterator_extreme_key_test();
LAB_00115757:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x11575c;
      iterator_extreme_key_test();
LAB_0011575c:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115761;
      iterator_extreme_key_test();
LAB_00115761:
      (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = 0x115766;
      iterator_extreme_key_test();
    }
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size =
         (uint64_t)iterator_inmem_snapshot_seek_test;
    iterator_extreme_key_test();
    (((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config).buffercache_size = (uint64_t)pcVar50;
    *(char **)&((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->config = pcVar52;
    ((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->fileops = (filemgr_ops *)pfVar18;
    ((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->btreeblkops = (btree_blk_ops *)pfVar53;
    ((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->bhandle = (btreeblk_handle *)doc_02;
    ((fdb_kvs_handle *)(_Var20._M_i + -0xc30))->dhandle = (docio_handle *)fconfig_01;
    sVar12 = (ulong)pfVar48 & 0xffffffff;
    pvVar60 = (void *)0x0;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115790;
    gettimeofday((timeval *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->bhandle,
                 (__timezone_ptr_t)0x0);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115795;
    memleak_start();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).num_entries = 0;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1157a6;
    system("rm -rf  iterator_test* > errorlog.txt");
    pfVar21 = (fdb_doc *)&(((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->config).num_blocks_readahead;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1157b6;
    fdb_get_default_config();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1157c0;
    fdb_get_default_kvs_config();
    (((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->log_callback).callback = (fdb_log_callback)0x0;
    (((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->log_callback).callback_ex =
         (fdb_log_callback_ex)0x400;
    *(undefined4 *)
     ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->cur_header_revnum).
             super___atomic_base<unsigned_long>._M_i + 4) = 1;
    *(undefined1 *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->rollback_revnum + 7) = 0;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1157eb;
    fVar9 = fdb_open((fdb_file_handle **)(_Var20._M_i + -0x1040),"./iterator_test1",
                     (fdb_config *)pfVar21);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      *(int *)((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config).custom_cmp + 4) =
           (int)pfVar48;
      pfVar18 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11580b;
      fVar9 = fdb_kvs_open_default
                        ((fdb_file_handle *)pfVar18,
                         &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle,
                         (fdb_kvs_config *)
                         &(((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config).custom_cmp_param
                        );
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115c00;
      pfVar53 = (filemgr *)0x0;
      uVar51 = 0;
      do {
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115836;
        sprintf((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->btreeblkops,"%c2",
                (ulong)((int)uVar51 + 0x61));
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11584f;
        sprintf((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->log_callback,"meta%d",
                uVar51 & 0xffffffff);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115868;
        sprintf((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->fileops,"body%d",
                uVar51 & 0xffffffff);
        doc_02 = (char *)(_Var20._M_i + (long)pfVar53 + -0x1018);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115878;
        sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->btreeblkops);
        pfVar21 = (fdb_doc *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->log_callback;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11588b;
        pcVar52 = (char *)strlen((char *)pfVar21);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11589b;
        sVar14 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->fileops);
        *(size_t *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators = sVar14;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1158c0;
        fdb_doc_create((fdb_doc **)doc_02,&((fdb_kvs_handle *)(_Var20._M_i + -0xe38))->btreeblkops,
                       sVar12,pfVar21,(size_t)pcVar52,
                       &((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->fileops,
                       *(size_t *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators);
        pfVar18 = (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle;
        doc = *(fdb_doc **)(_Var20._M_i + uVar51 * 8 + -0x1018);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1158cf;
        fdb_set(pfVar18,doc);
        uVar51 = uVar51 + 1;
        pfVar53 = (filemgr *)((long)pfVar53 + 8);
      } while (uVar51 != 5);
      pfVar18 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config;
      opt = *(fdb_commit_opt_t *)
             ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config).custom_cmp + 4);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1158ef;
      fdb_commit((fdb_file_handle *)pfVar18,opt);
      pfVar18 = (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115905;
      fVar9 = fdb_snapshot_open(pfVar18,(fdb_kvs_handle **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).
                                         space_used,0xffffffffffffffff);
      pvVar60 = (void *)0x5;
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115c05;
      pfVar18 = (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115925;
      fVar9 = fdb_set_log_callback(pfVar18,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115c0a;
      pfVar18 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators = 0xe;
      pfVar21 = (fdb_doc *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x11595f;
      fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar21,"b2",2,"d2",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators);
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115978;
      fVar9 = fdb_iterator_seek(pfVar3,"c1",2,'\x01');
      if (fVar9 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c0f;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115999;
      fVar9 = fdb_iterator_seek(pfVar3,"c3",2,'\0');
      if (fVar9 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c14;
      pfVar21 = (fdb_doc *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx;
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1159af;
      fdb_iterator_close(pfVar3);
      pfVar18 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators = 0xe;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1159dc;
      fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar21,"b3",2,"d1",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators);
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x1159f5;
      fVar9 = fdb_iterator_seek(pfVar3,"c1",2,'\x01');
      if (fVar9 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c19;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a16;
      fVar9 = fdb_iterator_seek(pfVar3,"c3",2,'\0');
      if (fVar9 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c1e;
      pfVar21 = (fdb_doc *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx;
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a2c;
      fdb_iterator_close(pfVar3);
      pfVar18 = (fdb_kvs_handle *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).space_used;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators = 0xe;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a59;
      fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar21,"b0",2,"e2",2,
                        (fdb_iterator_opt_t)
                        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->num_iterators);
      pfVar3 = (fdb_iterator *)((bottom_up_build_ctx *)pfVar21)->entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a61;
      fVar9 = fdb_iterator_seek_to_max(pfVar3);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115c23;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a78;
      fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).
                                       num_entries);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115c28;
      pfVar21 = (fdb_doc *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).num_entries;
      sVar14 = pfVar21->keylen;
      pvVar60 = pfVar21->key;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115a9b;
      iVar10 = bcmp(pvVar60,"d2",sVar14);
      if (iVar10 != 0) goto LAB_00115c2d;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115aab;
      fdb_doc_free(pfVar21);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).num_entries = 0;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115acc;
      fVar9 = fdb_iterator_seek(pfVar3,"e2",2,'\0');
      if (fVar9 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c35;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115adf;
      fVar9 = fdb_iterator_seek_to_min(pfVar3);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115c3a;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115af6;
      fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).
                                       num_entries);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115c3f;
      pfVar21 = (fdb_doc *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).num_entries;
      sVar14 = pfVar21->keylen;
      pvVar60 = pfVar21->key;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b19;
      iVar10 = bcmp(pvVar60,"c2",sVar14);
      if (iVar10 != 0) goto LAB_00115c44;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b29;
      fdb_doc_free(pfVar21);
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b44;
      fVar9 = fdb_iterator_seek(pfVar3,"b0",2,'\x01');
      if (fVar9 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c4c;
      pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b68;
      fVar9 = fdb_iterator_seek(pfVar3,"b0",2,'\x01');
      if (fVar9 == FDB_RESULT_ITERATOR_FAIL) {
        pfVar3 = (fdb_iterator *)(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).entries;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b7b;
        fdb_iterator_close(pfVar3);
        pfVar18 = (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).handle;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b85;
        fdb_kvs_close(pfVar18);
        pfVar18 = (fdb_kvs_handle *)
                  (((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->bub_ctx).space_used;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b8f;
        fdb_kvs_close(pfVar18);
        pfVar18 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1040))->kvs_config;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115b99;
        fdb_close((fdb_file_handle *)pfVar18);
        lVar54 = 0;
        do {
          pfVar21 = *(fdb_doc **)(_Var20._M_i + lVar54 * 8 + -0x1018);
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115ba5;
          fdb_doc_free(pfVar21);
          lVar54 = lVar54 + 1;
        } while (lVar54 != 5);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115bb3;
        fdb_shutdown();
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115bb8;
        memleak_end();
        pcVar52 = "%s PASSED\n";
        if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
          pcVar52 = "%s FAILED\n";
        }
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115be9;
        fprintf(_stderr,pcVar52,"in-memory snapshot seek test");
        return;
      }
    }
    else {
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c00;
      iterator_inmem_snapshot_seek_test();
LAB_00115c00:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c05;
      iterator_inmem_snapshot_seek_test();
LAB_00115c05:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c0a;
      iterator_inmem_snapshot_seek_test();
LAB_00115c0a:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c0f;
      iterator_inmem_snapshot_seek_test();
LAB_00115c0f:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c14;
      iterator_inmem_snapshot_seek_test();
LAB_00115c14:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c19;
      iterator_inmem_snapshot_seek_test();
LAB_00115c19:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c1e;
      iterator_inmem_snapshot_seek_test();
LAB_00115c1e:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c23;
      iterator_inmem_snapshot_seek_test();
LAB_00115c23:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c28;
      iterator_inmem_snapshot_seek_test();
LAB_00115c28:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c2d;
      iterator_inmem_snapshot_seek_test();
LAB_00115c2d:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c35;
      iterator_inmem_snapshot_seek_test();
LAB_00115c35:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c3a;
      iterator_inmem_snapshot_seek_test();
LAB_00115c3a:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c3f;
      iterator_inmem_snapshot_seek_test();
LAB_00115c3f:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c44;
      iterator_inmem_snapshot_seek_test();
LAB_00115c44:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c4c;
      iterator_inmem_snapshot_seek_test();
LAB_00115c4c:
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)0x115c51;
      iterator_inmem_snapshot_seek_test();
    }
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)iterator_no_deletes_test;
    iterator_inmem_snapshot_seek_test();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->node = (kvs_opened_node *)sVar12;
    *(char **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->handle_busy = pcVar52;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->txn = (fdb_txn *)pvVar60;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->filename = (char *)pfVar53;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->max_seqnum = (fdb_seqnum_t)doc_02;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->seqnum = (fdb_seqnum_t)pfVar21;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115c76;
    gettimeofday((timeval *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).seqtree_opt,
                 (__timezone_ptr_t)0x0);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115c7b;
    memleak_start();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats = (kvs_ops_stat *)0x0;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115c90;
    system("rm -rf  iterator_test* > errorlog.txt");
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115ca0;
    fdb_get_default_config();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cb0;
    fdb_get_default_kvs_config();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).compaction_cb =
         (fdb_compaction_callback)0x400;
    *(undefined4 *)
     ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).compaction_cb_ctx + 4) = 1;
    *(undefined1 *)
     ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).max_writer_lock_prob + 7) = 0;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cda;
    fdb_open((fdb_file_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->staletree,
             "./iterator_test",
             (fdb_config *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).prefetch_duration)
    ;
    pbVar4 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->staletree;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115cf1;
    fdb_kvs_open((fdb_file_handle *)pbVar4,
                 (fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle,"all_docs"
                 ,(fdb_kvs_config *)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->config).compaction_minimum_filesize
                );
    __s = &(((fdb_kvs_handle *)(_Var20._M_i + -0x1248))->config).compactor_sleep_duration;
    __s_00 = &((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->seqnum;
    lVar54 = 0;
    uVar51 = 0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d1b;
      sprintf((char *)__s,"key%d",uVar51 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d2f;
      sprintf((char *)__s_00,"body%d",uVar51 & 0xffffffff);
      lVar7 = lVar54 + -0x1410;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d3f;
      sVar12 = strlen((char *)__s);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d4a;
      sVar14 = strlen((char *)__s_00);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp_param = (void *)sVar14;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d64;
      fdb_doc_create((fdb_doc **)(_Var20._M_i + lVar7),__s,sVar12,(void *)0x0,0,__s_00,
                     (size_t)(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).
                             custom_cmp_param);
      pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
      pfVar21 = *(fdb_doc **)(_Var20._M_i + uVar51 * 8 + -0x1410);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d73;
      fdb_set(pfVar18,pfVar21);
      uVar51 = uVar51 + 1;
      lVar54 = lVar54 + 8;
    } while (uVar51 != 10);
    doc_00 = (list *)0x0;
    do {
      pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
      psVar5 = *(size_t **)(_Var20._M_i + (long)doc_00 * 8 + -0x1410);
      keylen = *psVar5;
      pvVar60 = (void *)psVar5[4];
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115d98;
      fVar9 = fdb_del_kv(pfVar18,pvVar60,keylen);
      if (fVar9 != FDB_RESULT_SUCCESS) {
        (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115f06;
        iterator_no_deletes_test();
        goto LAB_00115f06;
      }
      doc_00 = (list *)((long)&doc_00->head + 1);
    } while (doc_00 != (list *)0xa);
    pbVar4 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->staletree;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115db5;
    fdb_commit((fdb_file_handle *)pbVar4,'\0');
    pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
    pfVar21 = (fdb_doc *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->dhandle;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115dc4;
    fVar9 = fdb_set(pfVar18,pfVar21);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      pfVar53 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->dhandle->file;
      pvVar60 = (void *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->dhandle->lastBmpRevnum;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp_param = (void *)0x0;
      doc_00 = (list *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115df5;
      fdb_doc_create((fdb_doc **)doc_00,pvVar60,(size_t)pfVar53,(void *)0x0,0,(void *)0x0,
                     (size_t)(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).
                             custom_cmp_param);
      pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
      pfVar21 = *(fdb_doc **)doc_00;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e02;
      fVar9 = fdb_get(pfVar18,pfVar21);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115f0b;
      doc_01 = (hbtrie *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats;
      if (*(char *)&doc_01->map != '\0') {
        doc_00 = (list *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->trie;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115e27;
        iterator_no_deletes_test();
        doc_01 = *(hbtrie **)doc_00;
      }
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e2f;
      fdb_doc_free((fdb_doc *)doc_01);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats = (kvs_ops_stat *)0x0;
      pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp_param = 2
      ;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115e58;
      fVar9 = fdb_iterator_init(pfVar18,(fdb_iterator **)
                                        &((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->trie,
                                (void *)0x0,0,(void *)0x0,0,
                                *(fdb_iterator_opt_t *)
                                 &(((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).
                                  custom_cmp_param);
      if (fVar9 == FDB_RESULT_SUCCESS) {
        pfVar3 = (fdb_iterator *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->trie;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
             (fdb_custom_cmp_variable)0x115e6f;
        fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                        &((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats);
        if (fVar9 == FDB_RESULT_SUCCESS) {
          pfVar21 = (fdb_doc *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->op_stats;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115e81;
          fdb_doc_free(pfVar21);
          pfVar3 = (fdb_iterator *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->trie;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115e8b;
          fdb_iterator_close(pfVar3);
          lVar54 = 0;
          do {
            pfVar21 = *(fdb_doc **)(_Var20._M_i + lVar54 * 8 + -0x1410);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
                 (fdb_custom_cmp_variable)0x115e97;
            fdb_doc_free(pfVar21);
            lVar54 = lVar54 + 1;
          } while (lVar54 != 10);
          pfVar18 = (fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->fhandle;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115eaa;
          fdb_kvs_close(pfVar18);
          pbVar4 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->staletree;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115eb4;
          fdb_close((fdb_file_handle *)pbVar4);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115eb9;
          fdb_shutdown();
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115ebe;
          memleak_end();
          pcVar52 = "%s PASSED\n";
          if (iterator_no_deletes_test()::__test_pass != '\0') {
            pcVar52 = "%s FAILED\n";
          }
          (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
               (fdb_custom_cmp_variable)0x115eef;
          fprintf(_stderr,pcVar52,"iterator no deletes test");
          return;
        }
        goto LAB_00115f15;
      }
    }
    else {
LAB_00115f06:
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115f0b;
      iterator_no_deletes_test();
LAB_00115f0b:
      (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
           (fdb_custom_cmp_variable)0x115f10;
      iterator_no_deletes_test();
    }
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)0x115f15;
    iterator_no_deletes_test();
LAB_00115f15:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         iterator_set_del_docs_test;
    iterator_no_deletes_test();
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config).custom_cmp =
         (fdb_custom_cmp_variable)(_Var20._M_i + lVar7);
    *(long *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1450))->kvs_config = lVar54;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->bub_ctx).handle = (fdb_kvs_handle *)__s;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->bub_ctx).space_used = 10;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->bub_ctx).num_entries = (uint64_t)__s_00;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->bub_ctx).entries = doc_00;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f37;
    gettimeofday((timeval *)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).multi_kv_instances,
                 (__timezone_ptr_t)0x0);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f3c;
    memleak_start();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f4c;
    fdb_get_default_config();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f5c;
    fdb_get_default_kvs_config();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f68;
    system("rm -rf  iterator_test* > errorlog.txt");
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.algorithm = 0x400;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[0] = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[1] = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[2] = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[3] = '\0';
    pfVar6 = &((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config;
    (pfVar6->encryption_key).bytes[0x10] = '\x01';
    (pfVar6->encryption_key).bytes[0x11] = '\0';
    (pfVar6->encryption_key).bytes[0x12] = '\0';
    (pfVar6->encryption_key).bytes[0x13] = '\0';
    (((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).encryption_key.bytes[0x1b] = '\n';
    pfVar6 = &((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config;
    (pfVar6->encryption_key).bytes[8] = '\x01';
    (pfVar6->encryption_key).bytes[9] = '\0';
    (pfVar6->encryption_key).bytes[10] = '\0';
    (pfVar6->encryption_key).bytes[0xb] = '\0';
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115f96;
    fdb_open((fdb_file_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops,
             "./iterator_test1",
             (fdb_config *)
             &(((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->config).enable_background_compactor);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115fad;
    fdb_kvs_open((fdb_file_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops,
                 (fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,"kv1",
                 (fdb_kvs_config *)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).num_wal_partitions);
    psVar5 = &(((fdb_kvs_handle *)(_Var20._M_i + -0x1658))->config).max_writer_lock_prob;
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->bhandle = (btreeblk_handle *)0x0;
    iVar10 = 0;
    do {
      *(int *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->dhandle + 4) = iVar10;
      lVar54 = 0;
      uVar51 = 0;
      do {
        uVar16 = *(uint *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->dhandle + 4);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x115fed;
        sprintf((char *)psVar5,"key%02d%03d",(ulong)uVar16,uVar51 & 0xffffffff);
        __s_01 = &((fdb_kvs_handle *)(_Var20._M_i + -0x1860))->bub_ctx;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11600c;
        sprintf((char *)__s_01,"meta%02d%03d",(ulong)uVar16,uVar51 & 0xffffffff);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116023;
        sprintf((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).compaction_cb_ctx,
                "body%02d%03d",(ulong)uVar16,uVar51 & 0xffffffff);
        *(undefined1 **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config =
             (undefined1 *)(_Var20._M_i + lVar54 + -0x1a98);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11603a;
        sVar12 = strlen((char *)psVar5);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116045;
        sVar14 = strlen((char *)__s_01);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116055;
        sVar15 = strlen((char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).
                                 compaction_cb_ctx);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->staletree = (btree *)sVar15;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11607a;
        fdb_doc_create(*(fdb_doc ***)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config,psVar5,
                       sVar12,__s_01,sVar14,
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).compaction_cb_ctx,
                       (size_t)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->staletree);
        pfVar21 = *(fdb_doc **)(_Var20._M_i + uVar51 * 8 + -0x1a98);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11608c;
        fdb_set((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,pfVar21);
        uVar51 = uVar51 + 1;
        lVar54 = lVar54 + 8;
      } while (uVar51 != 100);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1160ac;
      fdb_commit((fdb_file_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops,'\x01');
      lVar54 = 0;
      do {
        pfVar21 = *(fdb_doc **)(_Var20._M_i + lVar54 * 8 + -0x19d0);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1160c0;
        fdb_del((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,pfVar21);
        lVar54 = lVar54 + 1;
      } while (lVar54 != 0x19);
      pbVar55 = (btreeblk_handle *)
                ((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->bhandle->blockpool).head + 3);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1160e1;
      fdb_commit((fdb_file_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops,'\x01');
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1160f0;
      fdb_get_kvs_info((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,
                       (fdb_kvs_info *)
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).wal_threshold);
      ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->bhandle = pbVar55;
      if (*(btreeblk_handle **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).seqtree_opt !=
          pbVar55) {
        *(undefined4 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->staletree = 0;
        uVar51 = 0;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116123;
        fdb_iterator_init((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file,
                          (fdb_iterator **)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->btreeblkops
                          ,(void *)0x0,0,(void *)0x0,0,
                          *(fdb_iterator_opt_t *)
                           &((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->staletree);
        do {
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116135;
          fdb_iterator_get((fdb_iterator *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->btreeblkops,
                           (fdb_doc **)
                           &(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).buffercache_size);
          pfVar21 = (fdb_doc *)
                    (((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).buffercache_size;
          uVar51 = (ulong)((int)uVar51 + (pfVar21->deleted ^ 1));
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116149;
          fdb_doc_free(pfVar21);
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116153;
          fVar9 = fdb_iterator_next((fdb_iterator *)
                                    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->btreeblkops);
        } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116162;
        fdb_iterator_close((fdb_iterator *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->btreeblkops)
        ;
        pbVar55 = ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->bhandle;
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11617a;
        printf("dbdocs(%d) expected(%d)\n",uVar51,(ulong)pbVar55 & 0xffffffff);
        if (*(btreeblk_handle **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->config).seqtree_opt
            != pbVar55) {
          ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161b9;
          iterator_set_del_docs_test();
        }
      }
      lVar54 = 0;
      do {
        pfVar21 = *(fdb_doc **)(_Var20._M_i + lVar54 * 8 + -0x1a98);
        ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x116190;
        fdb_doc_free(pfVar21);
        lVar54 = lVar54 + 1;
      } while (lVar54 != 100);
      iVar10 = *(int *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->dhandle + 4) + 1;
    } while (iVar10 != 0x14);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161c5;
    fdb_kvs_close((fdb_kvs_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->file);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161cf;
    fdb_close((fdb_file_handle *)((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->fileops);
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161d4;
    fdb_shutdown();
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x1161d9;
    memleak_end();
    pcVar52 = "%s PASSED\n";
    if (iterator_set_del_docs_test()::__test_pass != '\0') {
      pcVar52 = "%s FAILED\n";
    }
    ((fdb_kvs_handle *)(_Var20._M_i + -0x1c70))->trie = (hbtrie *)0x11620a;
    fprintf(_stderr,pcVar52,"iterator set del docs");
    return;
  }
  pfVar2 = *(fdb_file_handle **)
            ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113444;
  fVar9 = fdb_kvs_open(pfVar2,(fdb_kvs_handle **)
                              &((fdb_kvs_handle *)(_Var20._M_i + -0x618))->max_seqnum,"prev KVS",
                       (fdb_kvs_config *)
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).num_wal_partitions);
  pcVar50 = (char *)&aStack_370;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151ab;
  pfVar2 = *(fdb_file_handle **)
            ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11346a;
  fVar9 = fdb_kvs_open(pfVar2,(fdb_kvs_handle **)
                              &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key,
                       "cur KVS",
                       (fdb_kvs_config *)
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).num_wal_partitions);
  pcVar50 = (char *)&aStack_370;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151b0;
  pfVar2 = *(fdb_file_handle **)
            ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113493;
  fVar9 = fdb_kvs_open(pfVar2,(fdb_kvs_handle **)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->seqnum
                       ,"next KVS",
                       (fdb_kvs_config *)
                       &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).num_wal_partitions);
  pcVar50 = (char *)&aStack_370;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151b5;
  ((fdb_kvs_handle *)(_Var20._M_i + -0x618))->shandle = (snap_handle *)pfVar18;
  fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig_00 = (void *)0x79656b5f76657270;
  *(undefined1 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).max_writer_lock_prob = 0;
  pfVar18 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
  *(char **)pfVar18 = (char *)0x6c61765f76657270;
  *(undefined4 *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename + 7) = 0x65756c;
  pcVar52 = (char *)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->max_seqnum;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134e9;
  sVar12 = strlen(fconfig_00);
  doc_02 = (char *)(sVar12 + 1);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1134f5;
  sVar12 = strlen((char *)pfVar18);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11350a;
  fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar52,fconfig_00,(size_t)doc_02,pfVar18,sVar12 + 1);
  pcVar50 = (char *)&aStack_370;
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151ba;
  pcVar57 = (char *)0x79656b5f7478656e;
  fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig_00 = (void *)0x79656b5f7478656e;
  *(undefined1 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).max_writer_lock_prob = 0;
  pcVar50 = (char *)0x6c61765f7478656e;
  pfVar18 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
  *(char **)pfVar18 = (char *)0x6c61765f7478656e;
  *(undefined4 *)((long)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename + 7) = 0x65756c;
  pcVar52 = (char *)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->seqnum;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113558;
  sVar12 = strlen(fconfig_00);
  doc_02 = (char *)(sVar12 + 1);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113564;
  sVar12 = strlen((char *)pfVar18);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113579;
  fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar52,fconfig_00,(size_t)doc_02,pfVar18,sVar12 + 1);
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151bf;
  fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
  *(void **)fconfig_00 = (void *)0x79656b5f7478656e;
  *(undefined2 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).max_writer_lock_prob = 0x32;
  pfVar18 = (fdb_kvs_handle *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
  *(char **)pfVar18 = (char *)0x6c61765f7478656e;
  *(undefined4 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->txn = 0x326575;
  pcVar52 = (char *)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->seqnum;
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135b5;
  sVar12 = strlen(fconfig_00);
  doc_02 = (char *)(sVar12 + 1);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135c1;
  sVar12 = strlen((char *)pfVar18);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135d6;
  fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar52,fconfig_00,(size_t)doc_02,pfVar18,sVar12 + 1);
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151c4;
  pfVar2 = *(fdb_file_handle **)
            ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1135ed;
  fVar9 = fdb_commit(pfVar2,'\x01');
  if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151c9;
  if ((int)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->shandle == 0) {
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar52 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pcVar57 = (char *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113633;
      sprintf((char *)pfVar18,"key%06d",(ulong)pcVar57 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113643;
      sprintf(doc_02,"value%08d",(ulong)pcVar57 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113650;
      sVar12 = strlen((char *)pfVar18);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11365c;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113671;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig_00,doc_02,sVar12 + 1);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115125;
      *(undefined4 *)(_Var20._M_i + (long)pcVar57 * 4 + -0x4f8) = 0;
      pcVar57 = &((fdb_kvs_config *)&((filemgr *)pcVar57)->filename)->field_0x1;
    } while ((uint8_t *)pcVar57 != (uint8_t *)0x1e);
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11369a;
    fVar9 = fdb_commit(pfVar2,'\x01');
    pfVar53 = (filemgr *)pcVar57;
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115248;
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_0011370a:
      pfVar18 = (fdb_kvs_handle *)
                &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
      pcVar52 = "value%08d(WAL)";
      doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
      pcVar57 = (char *)(filemgr *)0x0;
      do {
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113738;
        sprintf((char *)pfVar18,"key%06d",(ulong)pcVar57 & 0xffffffff);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113748;
        sprintf(doc_02,"value%08d(WAL)",(ulong)pcVar57 & 0xffffffff);
        pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113755;
        sVar12 = strlen((char *)pfVar18);
        fconfig_00 = (char *)(sVar12 + 1);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113761;
        sVar12 = strlen(doc_02);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113776;
        fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig_00,doc_02,sVar12 + 1);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011512a;
        *(undefined4 *)(_Var20._M_i + (long)pcVar57 * 4 + -0x4f8) = 1;
        pfVar53 = (filemgr *)&((fdb_kvs_config *)&((filemgr *)pcVar57)->filename)->field_0x2;
        bVar61 = pcVar57 < (filemgr *)0x1c;
        pcVar57 = (char *)pfVar53;
      } while (bVar61);
      pfVar2 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1137a0;
      fVar9 = fdb_commit(pfVar2,'\0');
      if (fVar9 == FDB_RESULT_SUCCESS) {
LAB_001137a8:
        pfVar48 = *(fdb_kvs_handle **)
                   &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        *(uint *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).max_writer_lock_prob =
             (uint)(*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                             bytes + 0x10) != 0) * 2;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1137d0;
        fVar9 = fdb_iterator_init(pfVar48,(fdb_iterator **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                           enable_background_compactor,(void *)0x0,0,(void *)0x0,0,
                                  (fdb_iterator_opt_t)
                                  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                  max_writer_lock_prob);
        pcVar57 = (char *)pfVar53;
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151ce;
        pfVar18 = (fdb_kvs_handle *)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
        pcVar50 = "value%08d";
        pcVar52 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig_00 = (char *)0x0;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1137fb;
          fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)pfVar18);
          if (fVar9 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            uVar16 = (int)fconfig_00 +
                     (uint)(*(int *)(_Var20._M_i + (long)(int)fconfig_00 * 4 + -0x4f8) == 2);
            fconfig_00 = (char *)(ulong)uVar16;
            pcVar57 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar57 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113833;
            sprintf(pcVar52,pcVar57,(ulong)uVar16);
            doc_02 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar12 = ((btreeblk_handle *)doc_02)->ndeltanodes;
            pcVar57 = (char *)((btreeblk_handle *)doc_02)->log_callback;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11384d;
            iVar10 = bcmp(pcVar57,pcVar52,sVar12);
            if (iVar10 != 0) goto LAB_0011514f;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x11385d;
            fdb_doc_free((fdb_doc *)doc_02);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            fconfig_00 = (char *)(ulong)(uVar16 + 1);
          }
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113872;
          fVar9 = fdb_iterator_next(pfVar3);
        } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig_00 != 0x1e) goto LAB_001151d3;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11388e;
        fVar9 = fdb_iterator_prev(pfVar3);
        if (fVar9 == FDB_RESULT_ITERATOR_FAIL) {
LAB_001151a1:
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1151a6;
          iterator_complete_test();
          goto LAB_001151a6;
        }
        fconfig_00 = (char *)0x1e;
        pfVar18 = (fdb_kvs_handle *)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
        pcVar50 = "value%08d";
        pcVar52 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        do {
          uVar16 = (int)fconfig_00 - 1;
          fconfig_00 = (char *)(ulong)uVar16;
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1138bf;
          fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)pfVar18);
          if (fVar9 != FDB_RESULT_KEY_NOT_FOUND) {
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            uVar16 = uVar16 - (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) == 2);
            fconfig_00 = (char *)(ulong)uVar16;
            pcVar57 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar57 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1138f7;
            sprintf(pcVar52,pcVar57,(ulong)uVar16);
            doc_02 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar12 = ((btreeblk_handle *)doc_02)->ndeltanodes;
            pcVar57 = (char *)((btreeblk_handle *)doc_02)->log_callback;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113911;
            iVar10 = bcmp(pcVar57,pcVar52,sVar12);
            if (iVar10 != 0) goto LAB_0011515f;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113921;
            fdb_doc_free((fdb_doc *)doc_02);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
          }
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113934;
          fVar9 = fdb_iterator_prev(pfVar3);
        } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig_00 != 0) goto LAB_001151a1;
        pcVar52 = "key%06d";
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        fconfig_00 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        pcVar50 = (char *)0x0;
        do {
          if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar50 ==
              (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1e) goto LAB_00113a60;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113977;
          sprintf(doc_02,"key%06d",(ulong)pcVar50 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113984;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113995;
          fVar9 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_02,sVar12 + 1,'\0');
          if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001150f3;
          iVar10 = *(int *)(_Var20._M_i + (long)pcVar50 * 4 + -0x4f8);
          *(undefined1 **)
           ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               (undefined1 *)((long)pcVar50 + 1);
          uVar51 = (ulong)pcVar50 & 0xffffffff;
          if (iVar10 == 2) {
            uVar51 = (ulong)((long)pcVar50 + 1) & 0xffffffff;
          }
          do {
            uVar16 = (uint)uVar51;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1139bd;
            fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1139d4;
            sprintf(doc_02,"key%06d",uVar51);
            uVar16 = uVar16 + (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) == 2);
            pcVar57 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar57 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a07;
            sprintf(fconfig_00,pcVar57,(ulong)uVar16);
            pfVar18 = (fdb_kvs_handle *)
                      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
            pvVar60 = (pfVar18->kvs_config).custom_cmp_param;
            pcVar57 = (char *)(pfVar18->field_6).seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a1f;
            iVar10 = bcmp(pcVar57,fconfig_00,(size_t)pvVar60);
            if (iVar10 != 0) {
              (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                   (void *)0x115083;
              iterator_complete_test();
              goto LAB_00115083;
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a2f;
            fdb_doc_free((fdb_doc *)pfVar18);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar16 = uVar16 + 1;
            uVar51 = (ulong)uVar16;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113a44;
            fVar9 = fdb_iterator_next(pfVar3);
          } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
          pcVar50 = *(char **)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                               bytes + 0x14);
        } while (uVar16 == 0x1e);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a60;
        iterator_complete_test();
LAB_00113a60:
        pcVar52 = "key%06d";
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        fconfig_00 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        pcVar50 = (char *)0x0;
        do {
          if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar50 ==
              (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1e) goto LAB_00113b7b;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a92;
          sprintf(doc_02,"key%06d",(ulong)pcVar50 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113a9f;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ab0;
          fVar9 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_02,sVar12 + 1,'\0');
          if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001150f8;
          iVar10 = *(int *)(_Var20._M_i + (long)pcVar50 * 4 + -0x4f8);
          *(undefined1 **)
           ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               (undefined1 *)((long)pcVar50 + 1);
          uVar51 = (ulong)pcVar50 & 0xffffffff;
          if (iVar10 == 2) {
            uVar51 = (ulong)((long)pcVar50 + 1) & 0xffffffff;
          }
          do {
            uVar16 = (uint)uVar51;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ad8;
            fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113aef;
            sprintf(doc_02,"key%06d",uVar51);
            uVar16 = uVar16 - (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) == 2);
            pcVar57 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar57 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b22;
            sprintf(fconfig_00,pcVar57,(ulong)uVar16);
            pfVar18 = (fdb_kvs_handle *)
                      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
            pvVar60 = (pfVar18->kvs_config).custom_cmp_param;
            pcVar57 = (char *)(pfVar18->field_6).seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b3a;
            iVar10 = bcmp(pcVar57,fconfig_00,(size_t)pvVar60);
            if (iVar10 != 0) goto LAB_00115083;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b4a;
            fdb_doc_free((fdb_doc *)pfVar18);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar16 = uVar16 - 1;
            uVar51 = (ulong)uVar16;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113b5f;
            fVar9 = fdb_iterator_prev(pfVar3);
          } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
          pcVar50 = *(char **)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                               bytes + 0x14);
        } while (uVar16 == 0xffffffff);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113b7b;
        iterator_complete_test();
LAB_00113b7b:
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar50 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig_00 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ba0;
          sprintf(doc_02,"key%06d",(ulong)fconfig_00 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bad;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113bc1;
          fVar9 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_02,sVar12 + 1,'\x01');
          if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001150fd;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)(_Var20._M_i + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113be8;
            fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c04;
            sprintf(doc_02,"key%06d",pfVar18);
            uVar16 = (int)pfVar18 +
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar16;
            pcVar52 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar52 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c3a;
            sprintf(pcVar50,pcVar52,(ulong)uVar16);
            pcVar57 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            pvVar60 = *(void **)&((filemgr *)pcVar57)->blocksize;
            pcVar52 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar57)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c52;
            iVar10 = bcmp(pcVar52,pcVar50,(size_t)pvVar60);
            if (iVar10 != 0) goto LAB_00115093;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c62;
            fdb_doc_free((fdb_doc *)pcVar57);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar16 + 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113c78;
            fVar9 = fdb_iterator_next(pfVar3);
          } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != 0x1e) goto LAB_00115102;
          fconfig_00 = (char *)((long)&(((snap_handle *)fconfig_00)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig_00 != (snap_handle *)0x1e);
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar50 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig_00 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cbd;
          sprintf(doc_02,"key%06d",(ulong)fconfig_00 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cca;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113cde;
          fVar9 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_02,sVar12 + 1,'\x01');
          if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115107;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)(_Var20._M_i + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d05;
            fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d21;
            sprintf(doc_02,"key%06d",pfVar18);
            uVar16 = (int)pfVar18 -
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar16;
            pcVar52 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar52 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d57;
            sprintf(pcVar50,pcVar52,(ulong)uVar16);
            pcVar57 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            pvVar60 = *(void **)&((filemgr *)pcVar57)->blocksize;
            pcVar52 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar57)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d6f;
            iVar10 = bcmp(pcVar52,pcVar50,(size_t)pvVar60);
            if (iVar10 != 0) goto LAB_001150a3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d7f;
            fdb_doc_free((fdb_doc *)pcVar57);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar16 - 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113d95;
            fVar9 = fdb_iterator_prev(pfVar3);
          } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != -1) goto LAB_0011510c;
          fconfig_00 = (char *)((long)&(((snap_handle *)fconfig_00)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig_00 != (snap_handle *)0x1e);
        pcVar52 = "key%06d+";
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar57 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        uVar51 = 0;
        do {
          if (uVar51 == 0x1e) goto LAB_00113ed3;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113de7;
          sprintf(doc_02,"key%06d+",uVar51 & 0xffffffff);
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113df4;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113e05;
          fdb_iterator_seek(pfVar3,doc_02,sVar12 + 1,'\0');
          iVar10 = *(int *)(_Var20._M_i + uVar51 * 4 + -0x4f4);
          *(ulong *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes +
                    0x14) = uVar51 + 1;
          uVar59 = (ulong)((int)uVar51 + 2);
          if (iVar10 != 2) {
            uVar59 = uVar51 + 1 & 0xffffffff;
          }
          do {
            uVar16 = (uint)uVar59;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e2a;
            fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e42;
            sprintf(doc_02,"key%06d+",uVar59);
            uVar16 = uVar16 + (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar16;
            pcVar50 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar50 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e78;
            sprintf(pcVar57,pcVar50,(ulong)uVar16);
            pcVar50 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            aVar49 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar50 + 0x10);
            fconfig_00 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                                 ((long)pcVar50 + 0x40))->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113e90;
            iVar10 = bcmp(fconfig_00,pcVar57,(size_t)aVar49);
            if (iVar10 != 0) goto LAB_001150b3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113ea0;
            fdb_doc_free((fdb_doc *)pcVar50);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            uVar16 = uVar16 + 1;
            uVar59 = (ulong)uVar16;
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113eb6;
            fVar9 = fdb_iterator_next(pfVar3);
          } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
          uVar51 = *(ulong *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                              bytes + 0x14);
        } while (uVar16 == 0x1e);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ed3;
        iterator_complete_test();
LAB_00113ed3:
        fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx
        ;
        pcVar57 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        pcVar50 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ef8;
          sprintf(fconfig_00,"key%06d+",(ulong)pcVar50 & 0xffffffff);
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f05;
          sVar12 = strlen(fconfig_00);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113f16;
          fdb_iterator_seek(pfVar3,fconfig_00,sVar12 + 1,'\0');
          iVar10 = *(int *)(_Var20._M_i + (long)pcVar50 * 4 + -0x4f4);
          *(undefined1 **)
           ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x14) =
               (undefined1 *)((long)pcVar50 + 1);
          pfVar18 = (fdb_kvs_handle *)(ulong)((int)pcVar50 + 2);
          if (iVar10 != 2) {
            pfVar18 = (fdb_kvs_handle *)((ulong)((long)pcVar50 + 1) & 0xffffffff);
          }
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f3b;
            fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f57;
            sprintf(fconfig_00,"key%06d+",pfVar18);
            uVar16 = (int)pfVar18 -
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar16;
            pcVar52 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar52 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113f8d;
            sprintf(pcVar57,pcVar52,(ulong)uVar16);
            doc_02 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                             num_bgflusher_threads;
            sVar12 = ((btreeblk_handle *)doc_02)->ndeltanodes;
            pcVar52 = (char *)((btreeblk_handle *)doc_02)->log_callback;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fa7;
            iVar10 = bcmp(pcVar52,pcVar57,sVar12);
            if (iVar10 != 0) goto LAB_001150c3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fb7;
            fdb_doc_free((fdb_doc *)doc_02);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar16 - 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x113fcd;
            fVar9 = fdb_iterator_prev(pfVar3);
          } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
          if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar50 ==
              (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1d) goto LAB_00113ff0;
          pcVar50 = *(char **)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.
                               bytes + 0x14);
        } while ((int)pfVar18 == -1);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x113ff0;
        iterator_complete_test();
LAB_00113ff0:
        if ((int)pfVar18 != 0x1e) goto LAB_001151d8;
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar50 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig_00 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11401f;
          sprintf(doc_02,"key%06d+",(ulong)fconfig_00 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11402c;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114040;
          fVar9 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_02,sVar12 + 1,'\x01');
          if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115111;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)(_Var20._M_i + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114067;
            fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114083;
            sprintf(doc_02,"key%06d+",pfVar18);
            uVar16 = (int)pfVar18 +
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar16;
            pcVar52 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar52 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140b9;
            sprintf(pcVar50,pcVar52,(ulong)uVar16);
            pcVar57 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            pvVar60 = *(void **)&((filemgr *)pcVar57)->blocksize;
            pcVar52 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar57)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140d1;
            iVar10 = bcmp(pcVar52,pcVar50,(size_t)pvVar60);
            if (iVar10 != 0) goto LAB_001150d3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140e1;
            fdb_doc_free((fdb_doc *)pcVar57);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar16 + 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1140f7;
            fVar9 = fdb_iterator_next(pfVar3);
          } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != 0x1e) goto LAB_00115116;
          fconfig_00 = (char *)((long)&(((snap_handle *)fconfig_00)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig_00 != (snap_handle *)0x1e);
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar50 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        fconfig_00 = (char *)0x0;
        do {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11413c;
          sprintf(doc_02,"key%06d+",(ulong)fconfig_00 & 0xffffffff);
          pfVar18 = *(fdb_kvs_handle **)
                     &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                      enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114149;
          sVar12 = strlen(doc_02);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11415d;
          fVar9 = fdb_iterator_seek((fdb_iterator *)pfVar18,doc_02,sVar12 + 1,'\x01');
          if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011511b;
          pfVar18 = (fdb_kvs_handle *)
                    (ulong)((int)fconfig_00 -
                           (uint)(*(int *)(_Var20._M_i + (long)fconfig_00 * 4 + -0x4f8) == 2));
          do {
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114184;
            fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                            &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                             num_bgflusher_threads);
            if (fVar9 != FDB_RESULT_SUCCESS) break;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1141a0;
            sprintf(doc_02,"key%06d+",pfVar18);
            uVar16 = (int)pfVar18 -
                     (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
            pfVar18 = (fdb_kvs_handle *)(ulong)uVar16;
            pcVar52 = "value%08d";
            if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
              pcVar52 = "value%08d(WAL)";
            }
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1141d6;
            sprintf(pcVar50,pcVar52,(ulong)uVar16);
            pcVar57 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                              num_bgflusher_threads;
            pvVar60 = *(void **)&((filemgr *)pcVar57)->blocksize;
            pcVar52 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                              &((filemgr *)pcVar57)->io_in_prog)->seqtree;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1141ee;
            iVar10 = bcmp(pcVar52,pcVar50,(size_t)pvVar60);
            if (iVar10 != 0) goto LAB_001150e3;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x1141fe;
            fdb_doc_free((fdb_doc *)pcVar57);
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
            pfVar18 = (fdb_kvs_handle *)(ulong)(uVar16 - 1);
            pfVar3 = *(fdb_iterator **)
                      &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                       enable_background_compactor;
            (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx =
                 (void *)0x114214;
            fVar9 = fdb_iterator_prev(pfVar3);
          } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
          if ((int)pfVar18 != -1) goto LAB_00115120;
          fconfig_00 = (char *)((long)&(((snap_handle *)fconfig_00)->avl_id).parent + 1);
        } while ((snap_handle *)fconfig_00 != (snap_handle *)0x1e);
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11423e;
        fVar9 = fdb_iterator_seek_to_min(pfVar3);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151dd;
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar52 = "value%08d";
        pcVar57 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        pfVar18 = (fdb_kvs_handle *)0x0;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11426f;
          fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                           num_bgflusher_threads);
          if (fVar9 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11428b;
          sprintf(doc_02,"key%06d+",pfVar18);
          uVar16 = (int)pfVar18 +
                   (uint)(*(int *)(_Var20._M_i + (long)(int)pfVar18 * 4 + -0x4f8) == 2);
          pfVar18 = (fdb_kvs_handle *)(ulong)uVar16;
          pcVar50 = "value%08d";
          if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
            pcVar50 = "value%08d(WAL)";
          }
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142bd;
          sprintf(pcVar57,pcVar50,(ulong)uVar16);
          pcVar50 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                            num_bgflusher_threads;
          aVar49 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar50 + 0x10);
          fconfig_00 = (char *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                               ((long)pcVar50 + 0x40))->seqtree;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142d5;
          iVar10 = bcmp(fconfig_00,pcVar57,(size_t)aVar49);
          if (iVar10 != 0) goto LAB_0011512f;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142e5;
          fdb_doc_free((fdb_doc *)pcVar50);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
          pfVar18 = (fdb_kvs_handle *)(ulong)(uVar16 + 1);
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1142fb;
          fVar9 = fdb_iterator_next(pfVar3);
        } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)pfVar18 != 0x1e) goto LAB_001151e2;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114318;
        fVar9 = fdb_iterator_seek_to_max(pfVar3);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151e7;
        fconfig_00 = (char *)0x1d;
        doc_02 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        pcVar52 = "value%08d";
        pcVar57 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        do {
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11434b;
          fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                           num_bgflusher_threads);
          if (fVar9 != FDB_RESULT_SUCCESS) break;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114366;
          sprintf(doc_02,"key%06d+",fconfig_00);
          uVar16 = (int)fconfig_00 -
                   (uint)(*(int *)(_Var20._M_i + (long)(int)fconfig_00 * 4 + -0x4f8) == 2);
          fconfig_00 = (char *)(ulong)uVar16;
          pcVar50 = "value%08d";
          if (*(int *)(_Var20._M_i + (long)(int)uVar16 * 4 + -0x4f8) != 0) {
            pcVar50 = "value%08d(WAL)";
          }
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114395;
          sprintf(pcVar57,pcVar50,(ulong)uVar16);
          pcVar50 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                            num_bgflusher_threads;
          aVar49 = *(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar50 + 0x10);
          pfVar18 = (fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pcVar50 + 0x40))->
                    seqtree;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143ad;
          iVar10 = bcmp(pfVar18,pcVar57,(size_t)aVar49);
          if (iVar10 != 0) goto LAB_0011513f;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143bd;
          fdb_doc_free((fdb_doc *)pcVar50);
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
          fconfig_00 = (char *)(ulong)(uVar16 - 1);
          pfVar3 = *(fdb_iterator **)
                    &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                     enable_background_compactor;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143d2;
          fVar9 = fdb_iterator_prev(pfVar3);
        } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
        if ((int)fconfig_00 != -1) goto LAB_001151ec;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1143ee;
        fVar9 = fdb_iterator_close(pfVar3);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151f1;
        fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx
        ;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114414;
        sprintf(fconfig_00,"key%06d",0x14);
        pfVar18 = *(fdb_kvs_handle **)
                   &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114421;
        sVar12 = strlen(fconfig_00);
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).max_writer_lock_prob =
             8;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114440;
        fVar9 = fdb_iterator_init(pfVar18,(fdb_iterator **)
                                          &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                           enable_background_compactor,(void *)0x0,0,fconfig_00,
                                  sVar12 + 1,
                                  (fdb_iterator_opt_t)
                                  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                  max_writer_lock_prob);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151f6;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114452;
        fVar9 = fdb_iterator_seek_to_max(pfVar3);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_001151fb;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114469;
        fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                         num_bgflusher_threads);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115200;
        pcVar57 = "value%08d";
        fconfig_00 = "value%08d(WAL)";
        pcVar52 = "value%08d(WAL)";
        if (*(int *)((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->log_callback).callback + 4)
            == 0) {
          pcVar52 = "value%08d";
        }
        doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144a5;
        sprintf(doc_02,pcVar52,0x13);
        pfVar18 = (fdb_kvs_handle *)
                  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads;
        pvVar60 = (pfVar18->kvs_config).custom_cmp_param;
        pcVar52 = (char *)(pfVar18->field_6).seqtree;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144bd;
        iVar10 = bcmp(pcVar52,doc_02,(size_t)pvVar60);
        if (iVar10 != 0) goto LAB_00115205;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144cd;
        fdb_doc_free((fdb_doc *)pfVar18);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1144e0;
        fVar9 = fdb_iterator_close(pfVar3);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115215;
        pfVar18 = (fdb_kvs_handle *)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114506;
        sprintf((char *)pfVar18,"key%06d",10);
        pcVar52 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114513;
        sVar12 = strlen((char *)pfVar18);
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).max_writer_lock_prob =
             4;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114534;
        fVar9 = fdb_iterator_init((fdb_kvs_handle *)pcVar52,
                                  (fdb_iterator **)
                                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                   enable_background_compactor,pfVar18,sVar12 + 1,(void *)0x0,0,
                                  (fdb_iterator_opt_t)
                                  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                  max_writer_lock_prob);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011521a;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114546;
        fVar9 = fdb_iterator_seek_to_min(pfVar3);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011521f;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11455d;
        fVar9 = fdb_iterator_get(pfVar3,(fdb_doc **)
                                        &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                                         num_bgflusher_threads);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115224;
        if (*(int *)((long)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                            breakpad_minidump_dir + 4) == 0) {
          fconfig_00 = "value%08d";
        }
        pcVar52 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114588;
        sprintf(pcVar52,fconfig_00,0xb);
        fconfig_00 = (char *)(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).
                             num_bgflusher_threads;
        __n = (((snap_handle *)fconfig_00)->avl_id).right;
        pfVar18 = (fdb_kvs_handle *)((snap_handle *)fconfig_00)->seqnum;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145a0;
        iVar10 = bcmp(pfVar18,pcVar52,(size_t)__n);
        if (iVar10 != 0) goto LAB_00115229;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145b0;
        fdb_doc_free((fdb_doc *)fconfig_00);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).num_bgflusher_threads = 0;
        pfVar3 = *(fdb_iterator **)
                  &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).enable_background_compactor;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145c3;
        fVar9 = fdb_iterator_close(pfVar3);
        fconfig_00 = (char *)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->shandle;
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115239;
        pfVar2 = *(fdb_file_handle **)
                  ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145dd;
        fVar9 = fdb_close(pfVar2);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011523e;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145ea;
        fVar9 = fdb_shutdown();
        if (fVar9 == FDB_RESULT_SUCCESS) {
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1145f7;
          memleak_end();
          (((fdb_kvs_handle *)(_Var20._M_i + -0x410))->bub_ctx).entries = (list *)0x20747365742065;
          ((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node = (kvs_opened_node *)0x726f746172657469;
          *(undefined8 *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->num_iterators =
               0x74656c706d6f6320;
          if ((int)fconfig_00 != 0) goto LAB_00114825;
          (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11462d;
          sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
          builtin_strncpy((char *)(_Var20._M_i + (sVar12 - 0x238)),"(HB+trie: all, W",0x10);
          uVar62._0_1_ = ' ';
          uVar62._1_1_ = 'a';
          uVar62._2_1_ = 'l';
          uVar62._3_1_ = 'l';
          uVar64._0_1_ = ',';
          uVar64._1_1_ = ' ';
          uVar64._2_1_ = 'W';
          uVar64._3_1_ = 'A';
          uVar66._0_1_ = 'L';
          uVar66._1_1_ = ':';
          uVar66._2_1_ = ' ';
          uVar66._3_1_ = 'e';
          uVar68._0_1_ = 'v';
          uVar68._1_1_ = 'e';
          uVar68._2_1_ = 'n';
          uVar68._3_1_ = '\0';
          goto LAB_00114643;
        }
        goto LAB_00115243;
      }
      goto LAB_0011524d;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136c7;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136d4;
    sVar12 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136e3;
    fVar9 = fdb_del_kv(pfVar18,fconfig_00,sVar12 + 1);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115252;
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1136fa;
    fVar9 = fdb_commit(pfVar2,'\x01');
    if (fVar9 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_0011370a;
    }
    goto LAB_00115257;
  }
  switch((int)((fdb_kvs_handle *)(_Var20._M_i + -0x618))->shandle) {
  case 1:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar52 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar53 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146bf;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar53 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146cf;
      sprintf(doc_02,"value%08d",(ulong)pfVar53 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146dc;
      sVar12 = strlen((char *)pfVar18);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146e8;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1146fd;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig_00,doc_02,sVar12 + 1);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011516f;
      *(undefined4 *)(_Var20._M_i + (long)pfVar53 * 4 + -0x4f8) = 0;
      pfVar53 = (filemgr *)&((fdb_kvs_config *)&pfVar53->filename)->field_0x1;
    } while (pfVar53 != (filemgr *)0x1e);
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114726;
    fVar9 = fdb_commit(pfVar2,'\x01');
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011525c;
    pcVar52 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    doc_02 = "value%08d(WAL)";
    pfVar53 = (filemgr *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar48 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11475f;
      sprintf(pcVar52,"key%06d",(ulong)pfVar48 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11476f;
      sprintf((char *)pfVar53,"value%08d(WAL)",(ulong)pfVar48 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11477c;
      sVar12 = strlen(pcVar52);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114788;
      sVar12 = strlen((char *)pfVar53);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11479d;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pcVar52,(size_t)fconfig_00,pfVar53,sVar12 + 1);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011518d;
      *(undefined4 *)(_Var20._M_i + (long)pfVar48 * 4 + -0x4f8) = 1;
      pfVar18 = (fdb_kvs_handle *)&(pfVar48->kvs_config).field_0x2;
      bVar61 = pfVar48 < (fdb_kvs_handle *)0x1c;
      pfVar48 = pfVar18;
    } while (bVar61);
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        != 0) {
      fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147e0;
      sprintf(fconfig_00,"key%06d",0xf);
      pfVar18 = *(fdb_kvs_handle **)
                 &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147ed;
      sVar12 = strlen(fconfig_00);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1147fc;
      fVar9 = fdb_del_kv(pfVar18,fconfig_00,sVar12 + 1);
      if (fVar9 == FDB_RESULT_SUCCESS) {
        *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks
             = 2;
        goto LAB_0011480c;
      }
      goto LAB_0011528e;
    }
LAB_0011480c:
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114818;
    fVar9 = fdb_commit(pfVar2,'\0');
    if (fVar9 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114825;
    iterator_complete_test();
    break;
  case 2:
switchD_0011468f_caseD_2:
    pcVar52 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    doc_02 = "value%08d";
    pfVar53 = (filemgr *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar18 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c90;
      sprintf(pcVar52,"key%06d",(ulong)pfVar18 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ca0;
      sprintf((char *)pfVar53,"value%08d",(ulong)pfVar18 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cad;
      sVar12 = strlen(pcVar52);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cb9;
      sVar12 = strlen((char *)pfVar53);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cce;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pcVar52,(size_t)fconfig_00,pfVar53,sVar12 + 1);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115183;
      *(undefined4 *)(_Var20._M_i + (long)pfVar18 * 4 + -0x4f8) = 0;
      pfVar48 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x2;
      bVar61 = pfVar18 < (fdb_kvs_handle *)0x1c;
      pfVar18 = pfVar48;
    } while (bVar61);
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114cfb;
    fVar9 = fdb_commit(pfVar2,'\x01');
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115270;
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114d6b:
      pfVar18 = (fdb_kvs_handle *)
                &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
      pcVar52 = "value%08d(WAL)";
      doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
      pcVar57 = (char *)(filemgr *)0x0;
      do {
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d99;
        sprintf((char *)pfVar18,"key%06d",(ulong)pcVar57 & 0xffffffff);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114da9;
        sprintf(doc_02,"value%08d(WAL)",(ulong)pcVar57 & 0xffffffff);
        pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114db6;
        sVar12 = strlen((char *)pfVar18);
        fconfig_00 = (char *)(sVar12 + 1);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114dc2;
        sVar12 = strlen(doc_02);
        (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114dd7;
        fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig_00,doc_02,sVar12 + 1);
        if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011519c;
        *(undefined4 *)(_Var20._M_i + (long)pcVar57 * 4 + -0x4f8) = 1;
        pfVar53 = (filemgr *)&((fdb_kvs_config *)&((filemgr *)pcVar57)->filename)->field_0x2;
        bVar61 = pcVar57 < (filemgr *)0x1c;
        pcVar57 = (char *)pfVar53;
      } while (bVar61);
      pfVar2 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e01;
      fVar9 = fdb_commit(pfVar2,'\0');
      if (fVar9 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e0e;
      iterator_complete_test();
      goto switchD_0011468f_default;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d28;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d35;
    sVar12 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d44;
    fVar9 = fdb_del_kv(pfVar18,fconfig_00,sVar12 + 1);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115284;
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114d5b;
    fVar9 = fdb_commit(pfVar2,'\x01');
    if (fVar9 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114d6b;
    }
    goto LAB_00115289;
  case 3:
switchD_0011468f_caseD_3:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar52 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar58 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149eb;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar58 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149fb;
      sprintf(doc_02,"value%08d",(ulong)pfVar58 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a08;
      sVar12 = strlen((char *)pfVar18);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a14;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a29;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig_00,doc_02,sVar12 + 1);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115179;
      *(undefined4 *)(_Var20._M_i + (long)pfVar58 * 4 + -0x4f8) = 0;
      pfVar53 = (filemgr *)&((fdb_kvs_config *)&pfVar58->filename)->field_0x2;
      bVar61 = pfVar58 < (filemgr *)0x1c;
      pfVar58 = pfVar53;
    } while (bVar61);
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a56;
    fVar9 = fdb_commit(pfVar2,'\x01');
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115266;
    pcVar52 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    doc_02 = "value%08d(WAL)";
    pfVar53 = (filemgr *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar48 = (fdb_kvs_handle *)0x1;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a8f;
      sprintf(pcVar52,"key%06d",(ulong)pfVar48 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114a9f;
      sprintf((char *)pfVar53,"value%08d(WAL)",(ulong)pfVar48 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114aac;
      sVar12 = strlen(pcVar52);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ab8;
      sVar12 = strlen((char *)pfVar53);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114acd;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pcVar52,(size_t)fconfig_00,pfVar53,sVar12 + 1);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115192;
      *(undefined4 *)(_Var20._M_i + (long)pfVar48 * 4 + -0x4f8) = 1;
      pfVar18 = (fdb_kvs_handle *)&(pfVar48->kvs_config).field_0x2;
      bVar61 = pfVar48 < (fdb_kvs_handle *)0x1c;
      pfVar48 = pfVar18;
    } while (bVar61);
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114b3c:
      pfVar2 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b48;
      fVar9 = fdb_commit(pfVar2,'\0');
      if (fVar9 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b55;
      iterator_complete_test();
      goto switchD_0011468f_caseD_4;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b10;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b1d;
    sVar12 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b2c;
    fVar9 = fdb_del_kv(pfVar18,fconfig_00,sVar12 + 1);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114b3c;
    }
    goto LAB_00115293;
  case 4:
switchD_0011468f_caseD_4:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar52 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar53 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b83;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar53 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114b93;
      sprintf(doc_02,"value%08d",(ulong)pfVar53 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ba0;
      sVar12 = strlen((char *)pfVar18);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bac;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bc1;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig_00,doc_02,sVar12 + 1);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011517e;
      *(undefined4 *)(_Var20._M_i + (long)pfVar53 * 4 + -0x4f8) = 0;
      pfVar53 = (filemgr *)&((fdb_kvs_config *)&pfVar53->filename)->field_0x1;
    } while (pfVar53 != (filemgr *)0x1e);
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114bea;
    fVar9 = fdb_commit(pfVar2,'\x01');
    pfVar48 = pfVar18;
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_0011526b;
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114c43:
      pfVar2 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c52;
      fVar9 = fdb_commit(pfVar2,'\x01');
      if (fVar9 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c5f;
      iterator_complete_test();
      goto switchD_0011468f_caseD_2;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c17;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c24;
    sVar12 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114c33;
    fVar9 = fdb_del_kv(pfVar18,fconfig_00,sVar12 + 1);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114c43;
    }
    goto LAB_0011527f;
  case 5:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar52 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar53 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148e7;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar53 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148f7;
      sprintf(doc_02,"value%08d",(ulong)pfVar53 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114904;
      sVar12 = strlen((char *)pfVar18);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114910;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114925;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig_00,doc_02,sVar12 + 1);
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115174;
      *(undefined4 *)(_Var20._M_i + (long)pfVar53 * 4 + -0x4f8) = 0;
      pfVar53 = (filemgr *)&((fdb_kvs_config *)&pfVar53->filename)->field_0x1;
    } while (pfVar53 != (filemgr *)0x1e);
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11494b;
    fVar9 = fdb_commit(pfVar2,'\0');
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115261;
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_001149a4:
      pfVar2 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149b0;
      fVar9 = fdb_commit(pfVar2,'\0');
      if (fVar9 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1149bd;
      iterator_complete_test();
      goto switchD_0011468f_caseD_3;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114978;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114985;
    sVar12 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114994;
    fVar9 = fdb_del_kv(pfVar18,fconfig_00,sVar12 + 1);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_001149a4;
    }
    goto LAB_0011527a;
  default:
switchD_0011468f_default:
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar52 = "value%08d";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar53 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e3c;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar53 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e4c;
      sprintf(doc_02,"value%08d",(ulong)pfVar53 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e59;
      sVar12 = strlen((char *)pfVar18);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e65;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114e7a;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig_00,doc_02,sVar12 + 1);
      pfVar48 = pfVar18;
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115188;
      *(undefined4 *)(_Var20._M_i + (long)pfVar53 * 4 + -0x4f8) = 0;
      pfVar53 = (filemgr *)&((fdb_kvs_config *)&pfVar53->filename)->field_0x1;
    } while (pfVar53 != (filemgr *)0x1e);
    pfVar2 = *(fdb_file_handle **)
              ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ea3;
    fVar9 = fdb_commit(pfVar2,'\x01');
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115275;
    pfVar18 = (fdb_kvs_handle *)
              &(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    pcVar52 = "value%08d(WAL)";
    doc_02 = (char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x618))->filename;
    pfVar53 = (filemgr *)0x0;
    do {
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ed9;
      sprintf((char *)pfVar18,"key%06d",(ulong)pfVar53 & 0xffffffff);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ee9;
      sprintf(doc_02,"value%08d(WAL)",(ulong)pfVar53 & 0xffffffff);
      pcVar50 = *(char **)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ef6;
      sVar12 = strlen((char *)pfVar18);
      fconfig_00 = (char *)(sVar12 + 1);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f02;
      sVar12 = strlen(doc_02);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f17;
      fVar9 = fdb_set_kv((fdb_kvs_handle *)pcVar50,pfVar18,(size_t)fconfig_00,doc_02,sVar12 + 1);
      pcVar57 = (char *)pfVar53;
      if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00115197;
      *(undefined4 *)(_Var20._M_i + (long)pfVar53 * 4 + -0x4f8) = 1;
      pfVar53 = (filemgr *)&((fdb_kvs_config *)&pfVar53->filename)->field_0x1;
    } while (pfVar53 != (filemgr *)0x1e);
    if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10)
        == 0) {
LAB_00114f82:
      pfVar2 = *(fdb_file_handle **)
                ((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 4);
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f8e;
      fVar9 = fdb_commit(pfVar2,'\0');
      if (fVar9 == FDB_RESULT_SUCCESS) goto LAB_001137a8;
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f9b;
      iterator_complete_test();
switchD_0011483e_caseD_5:
      (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fa8;
      sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
      builtin_strncpy((char *)(_Var20._M_i + (sVar12 - 0x238)),"(HB+trie: empty,",0x10);
      uVar63._0_1_ = 'e';
      uVar63._1_1_ = 'm';
      uVar63._2_1_ = 'p';
      uVar63._3_1_ = 't';
      uVar65._0_1_ = 'y';
      uVar65._1_1_ = ',';
      uVar65._2_1_ = ' ';
      uVar65._3_1_ = 'W';
      uVar67._0_1_ = 'A';
      uVar67._1_1_ = 'L';
      uVar67._2_1_ = ':';
      uVar67._3_1_ = ' ';
      uVar69._0_1_ = 'a';
      uVar69._1_1_ = 'l';
      uVar69._2_1_ = 'l';
      uVar69._3_1_ = '\0';
LAB_0011500b:
      pcVar52 = (char *)(_Var20._M_i + (sVar12 - 0x22e));
      *(undefined4 *)pcVar52 = uVar63;
      *(undefined4 *)(pcVar52 + 4) = uVar65;
      *(undefined4 *)(pcVar52 + 8) = uVar67;
      *(undefined4 *)(pcVar52 + 0xc) = uVar69;
      goto switchD_0011483e_default;
    }
    fconfig_00 = (char *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x410))->config).compaction_cb_ctx;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f56;
    sprintf(fconfig_00,"key%06d",0xf);
    pfVar18 = *(fdb_kvs_handle **)
               &(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key;
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f63;
    sVar12 = strlen(fconfig_00);
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114f72;
    fVar9 = fdb_del_kv(pfVar18,fconfig_00,sVar12 + 1);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      *(undefined4 *)&(((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).do_not_cache_doc_blocks =
           2;
      goto LAB_00114f82;
    }
    goto LAB_00115298;
  }
LAB_00114825:
  switch((int)fconfig_00) {
  case 1:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11484d;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    *(undefined8 *)(_Var20._M_i + (sVar12 - 0x228)) = 0x64646f203a4c41;
    break;
  case 2:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x115025;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var20._M_i + (sVar12 - 0x238)),"(HB+trie: odd, W",0x10);
    uVar62._0_1_ = ' ';
    uVar62._1_1_ = 'o';
    uVar62._2_1_ = 'd';
    uVar62._3_1_ = 'd';
    uVar64._0_1_ = ',';
    uVar64._1_1_ = ' ';
    uVar64._2_1_ = 'W';
    uVar64._3_1_ = 'A';
    uVar66._0_1_ = 'L';
    uVar66._1_1_ = ':';
    uVar66._2_1_ = ' ';
    uVar66._3_1_ = 'e';
    uVar68._0_1_ = 'v';
    uVar68._1_1_ = 'e';
    uVar68._2_1_ = 'n';
    uVar68._3_1_ = '\0';
    goto LAB_00114643;
  case 3:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114fcd;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var20._M_i + (sVar12 - 0x238)),"(HB+trie: even, ",0x10);
    uVar62._0_1_ = ' ';
    uVar62._1_1_ = 'e';
    uVar62._2_1_ = 'v';
    uVar62._3_1_ = 'e';
    uVar64._0_1_ = 'n';
    uVar64._1_1_ = ',';
    uVar64._2_1_ = ' ';
    uVar64._3_1_ = 'W';
    uVar66._0_1_ = 'A';
    uVar66._1_1_ = 'L';
    uVar66._2_1_ = ':';
    uVar66._3_1_ = ' ';
    uVar68._0_1_ = 'o';
    uVar68._1_1_ = 'd';
    uVar68._2_1_ = 'd';
    uVar68._3_1_ = '\0';
LAB_00114643:
    pcVar52 = (char *)(_Var20._M_i + (sVar12 - 0x22f));
    *(undefined4 *)pcVar52 = uVar62;
    *(undefined4 *)(pcVar52 + 4) = uVar64;
    *(undefined4 *)(pcVar52 + 8) = uVar66;
    *(undefined4 *)(pcVar52 + 0xc) = uVar68;
    goto switchD_0011483e_default;
  case 4:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114ff5;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    builtin_strncpy((char *)(_Var20._M_i + (sVar12 - 0x238)),"(HB+trie: all, W",0x10);
    uVar63._0_1_ = 'a';
    uVar63._1_1_ = 'l';
    uVar63._2_1_ = 'l';
    uVar63._3_1_ = ',';
    uVar65._0_1_ = ' ';
    uVar65._1_1_ = 'W';
    uVar65._2_1_ = 'A';
    uVar65._3_1_ = 'L';
    uVar67._0_1_ = ':';
    uVar67._1_1_ = ' ';
    uVar67._2_1_ = 'e';
    uVar67._3_1_ = 'm';
    uVar69._0_1_ = 'p';
    uVar69._1_1_ = 't';
    uVar69._2_1_ = 'y';
    uVar69._3_1_ = '\0';
    goto LAB_0011500b;
  case 5:
    goto switchD_0011483e_caseD_5;
  case 6:
    (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x11504d;
    sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
    *(undefined8 *)(_Var20._M_i + (sVar12 - 0x228)) = 0x6c6c61203a4c41;
    break;
  default:
    goto switchD_0011483e_default;
  }
  builtin_strncpy((char *)(_Var20._M_i + (sVar12 - 0x238)),"(HB+trie: all, W",0x10);
switchD_0011483e_default:
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x114658;
  sVar12 = strlen((char *)&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
  pcVar52 = (char *)(_Var20._M_i + (sVar12 - 0x238));
  if (*(int *)((((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).encryption_key.bytes + 0x10) ==
      0) {
    pcVar52[0] = ')';
    pcVar52[1] = '\0';
  }
  else {
    builtin_strncpy(pcVar52,", do",4);
    builtin_strncpy((char *)(_Var20._M_i + (sVar12 - 0x234)),"c de",4);
    builtin_strncpy((char *)(_Var20._M_i + (sVar12 - 0x230)),"leti",4);
    builtin_strncpy((char *)(_Var20._M_i + (sVar12 - 0x22c)),"on)",4);
  }
  pcVar52 = "%s PASSED\n";
  if (iterator_complete_test(int,int)::__test_pass != '\0') {
    pcVar52 = "%s FAILED\n";
  }
  (((fdb_kvs_handle *)(_Var20._M_i + -0x618))->config).compaction_cb_ctx = (void *)0x1148a7;
  fprintf(_stderr,pcVar52,&((fdb_kvs_handle *)(_Var20._M_i + -0x410))->node);
  return;
}

Assistant:

void iterator_compact_uncommitted_db()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 10;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_iterator *it;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);


    // set docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_set_kv(db, keybuf, strlen(keybuf),
                bodybuf, strlen(bodybuf));
    }

    // count number of iteratable docs
    status = fdb_iterator_sequence_init(db, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i=0;
    do { ++i; }
    while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);
    TEST_CHK(i == n);

    // compact
    fdb_compact(dbfile, NULL);

    // set again
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_set_kv(db, keybuf, strlen(keybuf),
                bodybuf, strlen(bodybuf));
    }

    // count number of iteratable docs
    status = fdb_iterator_sequence_init(db, &it, 0, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i=0;
    do { ++i; }
    while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);
    TEST_CHK(i == n);


    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator compact uncommitted db");
}